

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1P3L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  XprTypeNested pMVar1;
  pointer ppVar2;
  pointer ppVar3;
  iterator __position;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined8 uVar27;
  SrcEvaluatorType srcEvaluator_1;
  double *pdVar28;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar29;
  ostream *poVar30;
  long lVar31;
  undefined8 *puVar32;
  pointer pMVar33;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar34;
  XprTypeNested pMVar35;
  iterator iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  byte bVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  undefined1 auVar124 [16];
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  undefined1 auVar125 [16];
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  undefined1 auVar168 [16];
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  undefined1 auVar285 [16];
  undefined4 uVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  undefined1 auVar305 [16];
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  undefined1 auVar328 [16];
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  undefined1 auVar337 [16];
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  vector<double,_std::allocator<double>_> realRoots;
  double b;
  double ty;
  double tx;
  type tmp;
  Matrix<double,_6,_1,_0,_6,_1> L32;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  Matrix<double,_4,_4,_0,_4,_4> transOut;
  Matrix<double,_6,_6,_0,_6,_6> TK;
  Matrix<double,_6,_6,_0,_6,_6> TL;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  double local_1a48;
  double dStack_1a40;
  double local_1a18;
  double dStack_1a10;
  double local_1a08;
  double dStack_1a00;
  double dStack_19e0;
  double local_19d8;
  double dStack_19d0;
  double local_1978;
  double dStack_1970;
  double local_1958;
  double dStack_1950;
  double dStack_1910;
  double dStack_1900;
  double local_18f8;
  double dStack_18f0;
  undefined4 uStack_1870;
  undefined4 uStack_186c;
  double dStack_1860;
  double local_1828;
  double dStack_1820;
  double local_17a8;
  double dStack_17a0;
  double dStack_1780;
  double local_1768;
  double dStack_1760;
  double dStack_1690;
  double dStack_15a0;
  undefined4 uStack_1580;
  undefined4 uStack_157c;
  double dStack_14a0;
  double dStack_1490;
  double dStack_1470;
  double dStack_1440;
  double dStack_1430;
  double dStack_12a0;
  double dStack_1250;
  double dStack_1160;
  double dStack_1130;
  double dStack_10a0;
  double dStack_1060;
  double dStack_1030;
  vector<double,_std::allocator<double>_> local_fd0;
  double local_fb8;
  double dStack_fb0;
  double local_fa8;
  double dStack_fa0;
  double local_f98;
  double dStack_f90;
  double local_f88;
  double dStack_f80;
  double local_f78;
  double dStack_f70;
  double local_f68;
  double dStack_f60;
  double local_f58;
  double dStack_f50;
  double local_f48;
  double dStack_f40;
  double local_f38;
  double dStack_f30;
  double local_f28;
  double dStack_f20;
  undefined1 local_f18 [16];
  double local_f08;
  double dStack_f00;
  double local_ef8;
  double dStack_ef0;
  double local_ee8;
  double dStack_ee0;
  double local_ed8;
  double dStack_ed0;
  double local_ec8;
  double dStack_ec0;
  undefined1 local_eb8 [16];
  double local_ea8;
  double dStack_ea0;
  double local_e98;
  double dStack_e90;
  double local_e88;
  double dStack_e80;
  double local_e78;
  double dStack_e70;
  double local_e68;
  double dStack_e60;
  SrcXprType local_e58;
  Matrix<double,_4,_4,_0,_4,_4> *local_e50;
  double local_e48;
  double dStack_e40;
  double local_e38;
  double dStack_e30;
  double local_e28;
  double dStack_e20;
  double local_e18;
  double dStack_e10;
  double local_e08;
  double dStack_e00;
  double local_df8;
  double dStack_df0;
  double local_de8;
  double dStack_de0;
  double local_dd8;
  double dStack_dd0;
  double local_dc8;
  double dStack_dc0;
  double local_db8;
  double dStack_db0;
  double local_da8;
  double dStack_da0;
  double local_d98;
  double dStack_d90;
  double local_d88;
  double dStack_d80;
  double local_d78;
  double dStack_d70;
  double local_d68;
  double dStack_d60;
  double local_d58;
  double dStack_d50;
  double local_d48;
  double dStack_d40;
  double local_d38;
  double dStack_d30;
  double local_d28;
  double dStack_d20;
  double local_d18;
  double dStack_d10;
  double local_d08;
  double dStack_d00;
  double local_cf8;
  double dStack_cf0;
  double local_ce8;
  double dStack_ce0;
  double local_cd8;
  double dStack_cd0;
  double local_cc8;
  double dStack_cc0;
  double local_cb8;
  double dStack_cb0;
  double local_ca8;
  double dStack_ca0;
  double local_c98;
  double dStack_c90;
  double local_c88;
  double dStack_c80;
  double local_c78;
  double dStack_c70;
  double local_c68;
  double dStack_c60;
  double local_c58;
  double dStack_c50;
  double local_c48;
  double dStack_c40;
  double local_c38;
  double dStack_c30;
  double local_c28;
  double dStack_c20;
  double local_c18;
  double dStack_c10;
  double local_c08;
  double dStack_c00;
  double local_bf8;
  double dStack_bf0;
  double local_be8;
  double dStack_be0;
  double local_bd8;
  double dStack_bd0;
  double local_bc8;
  double dStack_bc0;
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  double dStack_ba0;
  double local_b98;
  double dStack_b90;
  double local_b88;
  double dStack_b80;
  double local_b78;
  double dStack_b70;
  double local_b68;
  double dStack_b60;
  double local_b58;
  double dStack_b50;
  double local_b48;
  double dStack_b40;
  double local_b38;
  double dStack_b30;
  Scalar local_b20;
  Scalar local_b18;
  Scalar local_b10;
  Scalar local_b08;
  Scalar local_b00;
  Scalar local_af8;
  Scalar local_af0;
  Scalar local_ae8;
  Scalar local_ae0;
  double local_ad8;
  PointerType local_ad0;
  double local_ac8;
  double local_ac0;
  undefined1 local_ab8 [8];
  double dStack_ab0;
  scalar_constant_op<double> local_aa8;
  Matrix<double,_6,_6,_0,_6,_6> *pMStack_aa0;
  double local_a98;
  XprTypeNested pMStack_a90;
  variable_if_dynamic<long,__1> local_a88;
  variable_if_dynamic<long,__1> vStack_a80;
  XprTypeNested local_a78;
  variable_if_dynamic<long,__1> vStack_a70;
  variable_if_dynamic<long,__1> vStack_a68;
  double dStack_a60;
  double local_a58;
  double dStack_a50;
  double local_a48;
  double dStack_a40;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_a10;
  double local_9f8;
  double dStack_9f0;
  double local_9e8;
  double dStack_9e0;
  double local_9d8;
  double dStack_9d0;
  double local_9c8;
  double dStack_9c0;
  double local_9b8;
  double dStack_9b0;
  double local_9a8;
  double dStack_9a0;
  double local_998;
  double dStack_990;
  double local_988;
  double dStack_980;
  double local_978;
  undefined8 uStack_970;
  double local_968;
  double dStack_960;
  double local_958;
  double dStack_950;
  double local_948;
  double dStack_940;
  double local_938;
  double dStack_930;
  double local_928;
  double dStack_920;
  double local_918;
  double dStack_910;
  double local_908;
  double dStack_900;
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  double local_8d8;
  double dStack_8d0;
  double local_8c8;
  double dStack_8c0;
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  double local_888;
  undefined8 uStack_880;
  double local_878;
  double dStack_870;
  double local_868;
  double dStack_860;
  undefined1 local_858 [16];
  double local_848;
  double dStack_840;
  double local_838;
  double dStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  double local_7f8;
  double dStack_7f0;
  double local_7e8;
  double dStack_7e0;
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  double local_788;
  double dStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  double local_688;
  double dStack_680;
  double local_678;
  double dStack_670;
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  Matrix<double,_4,_4,_0,_4,_4> local_548;
  undefined1 local_4c8 [32];
  double local_4a8;
  double dStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  Matrix<double,_6,_6,_0,_6,_6> local_3a8;
  undefined1 local_288 [168];
  double adStack_1e0 [15];
  Matrix<double,_5,_1,_0,_5,_1> local_168;
  double dStack_140;
  Matrix<double,_4,_4,_0,_4,_4> local_138;
  Matrix<double,_3,_1,_0,_3,_1> local_b8;
  Matrix<double,_3,_1,_0,_3,_1> local_98;
  Matrix<double,_4,_1,_0,_4,_1> local_78;
  Matrix<double,_4,_1,_0,_4,_1> local_58;
  
  bVar40 = 0;
  ppVar2 = (plPair->
           super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((plPair->
       super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar2) ||
     (ppVar3 = (lPair->
               super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (ulong)((long)(lPair->
                   super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) < 0x101)) {
    poVar30 = std::operator<<((ostream *)&std::cerr,
                              "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
    std::endl<char,std::char_traits<char>>(poVar30);
    exit(-1);
  }
  dVar335 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[0];
  dVar73 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1];
  dVar81 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2];
  dVar280 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[3];
  dVar300 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[0];
  dVar319 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[1];
  dVar53 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2];
  dVar316 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array[3];
  dVar313 = *(double *)
             ((long)&(ppVar3->first).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar275 = *(double *)
             ((long)&(ppVar3->first).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar216 = *(double *)
             ((long)&(ppVar3->second).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar43 = *(double *)
            ((long)&(ppVar3->second).second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar192 = *(double *)
             ((long)&(ppVar3->second).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  auVar238._8_8_ = dVar313;
  auVar238._0_8_ = dVar313;
  auVar120 = divpd(*(undefined1 (*) [16])
                    &(ppVar3->first).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,auVar238);
  dVar313 = *(double *)
             ((long)&(ppVar3->first).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar313;
  auVar239._8_8_ = dVar275;
  auVar239._0_8_ = dVar275;
  auVar200 = divpd(*(undefined1 (*) [16])
                    &(ppVar3->first).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar239);
  dVar275 = *(double *)
             ((long)&(ppVar3->first).second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar275;
  dVar54 = auVar120._8_8_;
  dVar47 = auVar200._8_8_;
  dVar51 = auVar120._0_8_;
  dVar46 = auVar200._0_8_;
  local_4c8._8_8_ = local_578;
  dVar349 = *(double *)
             ((long)&ppVar3[1].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar217 = *(double *)
             ((long)&ppVar3[1].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar350 = *(double *)
             ((long)&ppVar3[1].second.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar44 = *(double *)
            ((long)&ppVar3[1].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar169 = *(double *)
             ((long)&ppVar3[1].second.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar41 = *(double *)
            ((long)&ppVar3[2].first.first.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  dVar42 = *(double *)
            ((long)&ppVar3[2].first.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar52 = *(double *)
            ((long)&ppVar3[2].first.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  auVar120 = *(undefined1 (*) [16])
              ((long)&ppVar3[2].second.first.
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar45 = *(double *)
            ((long)&ppVar3[2].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dVar72 = *(double *)
            ((long)&ppVar3[2].second.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x18);
  local_578._8_8_ = dVar47 - dVar54;
  local_578._0_8_ = dVar46 - dVar51;
  auVar201._8_8_ = dVar216;
  auVar201._0_8_ = dVar216;
  dVar216 = *(double *)
             ((long)&(ppVar3->second).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar216;
  auVar240 = divpd(*(undefined1 (*) [16])
                    &(ppVar3->second).first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage,auVar201
                  );
  auVar202._8_8_ = dVar349;
  auVar202._0_8_ = dVar349;
  dVar349 = *(double *)
             ((long)&ppVar3[1].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar349;
  auVar241 = divpd(*(undefined1 (*) [16])
                    &ppVar3[1].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,auVar202);
  auVar203._8_8_ = dVar217;
  auVar203._0_8_ = dVar217;
  auVar74 = divpd(*(undefined1 (*) [16])
                   &ppVar3[1].first.second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                  auVar203);
  dVar217 = *(double *)
             ((long)&ppVar3[1].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar217;
  auVar204._8_8_ = dVar350;
  auVar204._0_8_ = dVar350;
  dVar350 = *(double *)
             ((long)&ppVar3[1].second.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar350;
  auVar168 = divpd(*(undefined1 (*) [16])
                    &ppVar3[1].second.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage,auVar204
                  );
  auVar205._8_8_ = dVar41;
  auVar205._0_8_ = dVar41;
  dVar41 = *(double *)
            ((long)&ppVar3[2].first.first.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10) / dVar41;
  auVar121 = divpd(*(undefined1 (*) [16])
                    &ppVar3[2].first.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,auVar205);
  dVar26 = auVar120._8_8_;
  auVar206._8_8_ = dVar26;
  auVar206._0_8_ = dVar26;
  dVar26 = auVar120._0_8_ / dVar26;
  auVar305 = divpd(*(undefined1 (*) [16])
                    &ppVar3[2].second.first.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage,auVar206
                  );
  local_568._8_8_ = dVar47 * dVar313 - dVar54 * dVar275;
  local_568._0_8_ = dVar275 - dVar313;
  local_558._8_8_ = dVar46 * dVar54 - dVar51 * dVar47;
  local_558._0_8_ = dVar275 * dVar51 - dVar313 * dVar46;
  auVar122._8_8_ = dVar192;
  auVar122._0_8_ = dVar192;
  auVar75 = divpd(*(undefined1 (*) [16])
                   &(ppVar3->second).second.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                  auVar122);
  auVar200._8_8_ = dVar169;
  auVar200._0_8_ = dVar169;
  auVar328 = divpd(*(undefined1 (*) [16])
                    &ppVar3[1].second.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar200);
  auVar123._8_8_ = dVar52;
  auVar123._0_8_ = dVar52;
  auVar200 = divpd(*(undefined1 (*) [16])
                    &ppVar3[2].first.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar123);
  auVar120._8_8_ = dVar72;
  auVar120._0_8_ = dVar72;
  auVar337 = divpd(*(undefined1 (*) [16])
                    &ppVar3[2].second.second.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data,
                   auVar120);
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_4c8._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_4c8._8_8_;
  auVar76._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_4c8,(scalar_sum_op<double,_double> *)local_ab8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_3a8);
  auVar76._8_8_ = 0;
  auVar120 = sqrtpd(auVar76,auVar76);
  auVar77._0_8_ = auVar120._0_8_;
  auVar77._8_8_ = auVar77._0_8_;
  local_578 = divpd(local_578,auVar77);
  local_568 = divpd(local_568,auVar77);
  local_558 = divpd(local_558,auVar77);
  local_1958 = auVar74._0_8_;
  dStack_1950 = auVar74._8_8_;
  local_18f8 = auVar241._0_8_;
  dStack_18f0 = auVar241._8_8_;
  local_4c8._8_8_ = local_5a8;
  local_5a8._8_8_ = dStack_1950 - dStack_18f0;
  local_5a8._0_8_ = local_1958 - local_18f8;
  dVar42 = dVar42 / dVar52;
  local_598._8_8_ = dStack_1950 * dVar349 - dStack_18f0 * dVar217;
  local_598._0_8_ = dVar217 - dVar349;
  local_588._8_8_ = local_1958 * dStack_18f0 - local_18f8 * dStack_1950;
  local_588._0_8_ = dVar217 * local_18f8 - dVar349 * local_1958;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_4c8._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_4c8._8_8_;
  auVar74._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_4c8,(scalar_sum_op<double,_double> *)local_ab8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_3a8);
  auVar74._8_8_ = 0;
  auVar120 = sqrtpd(auVar74,auVar74);
  auVar241._0_8_ = auVar120._0_8_;
  auVar241._8_8_ = auVar241._0_8_;
  local_5a8 = divpd(local_5a8,auVar241);
  local_598 = divpd(local_598,auVar241);
  local_588 = divpd(local_588,auVar241);
  local_1768 = auVar200._0_8_;
  dStack_1760 = auVar200._8_8_;
  local_17a8 = auVar121._0_8_;
  dStack_17a0 = auVar121._8_8_;
  local_4c8._8_8_ = local_5d8;
  local_5d8._8_8_ = dStack_1760 - dStack_17a0;
  local_5d8._0_8_ = local_1768 - local_17a8;
  dVar43 = dVar43 / dVar192;
  dVar44 = dVar44 / dVar169;
  local_5c8._8_8_ = dStack_1760 * dVar41 - dStack_17a0 * dVar42;
  local_5c8._0_8_ = dVar42 - dVar41;
  local_5b8._8_8_ = local_1768 * dStack_17a0 - local_17a8 * dStack_1760;
  local_5b8._0_8_ = dVar42 * local_17a8 - dVar41 * local_1768;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_4c8._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_4c8._8_8_;
  auVar121._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_4c8,(scalar_sum_op<double,_double> *)local_ab8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_3a8);
  auVar121._8_8_ = 0;
  auVar120 = sqrtpd(auVar121,auVar121);
  auVar78._0_8_ = auVar120._0_8_;
  auVar78._8_8_ = auVar78._0_8_;
  local_5d8 = divpd(local_5d8,auVar78);
  local_5c8 = divpd(local_5c8,auVar78);
  local_5b8 = divpd(local_5b8,auVar78);
  local_1a08 = auVar75._0_8_;
  dStack_1a00 = auVar75._8_8_;
  local_1a18 = auVar240._0_8_;
  dStack_1a10 = auVar240._8_8_;
  local_4c8._8_8_ = local_608;
  local_608._8_8_ = dStack_1a00 - dStack_1a10;
  local_608._0_8_ = local_1a08 - local_1a18;
  local_5f8._8_8_ = dStack_1a00 * dVar216 - dStack_1a10 * dVar43;
  local_5f8._0_8_ = dVar43 - dVar216;
  local_5e8._8_8_ = local_1a08 * dStack_1a10 - local_1a18 * dStack_1a00;
  local_5e8._0_8_ = dVar43 * local_1a18 - dVar216 * local_1a08;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_4c8._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_4c8._8_8_;
  auVar75._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_4c8,(scalar_sum_op<double,_double> *)local_ab8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_3a8);
  auVar75._8_8_ = 0;
  auVar120 = sqrtpd(auVar75,auVar75);
  auVar240._0_8_ = auVar120._0_8_;
  auVar240._8_8_ = auVar240._0_8_;
  local_608 = divpd(local_608,auVar240);
  local_5f8 = divpd(local_5f8,auVar240);
  local_5e8 = divpd(local_5e8,auVar240);
  local_1828 = auVar328._0_8_;
  dStack_1820 = auVar328._8_8_;
  local_1978 = auVar168._0_8_;
  dStack_1970 = auVar168._8_8_;
  local_4c8._8_8_ = local_638;
  local_638._8_8_ = dStack_1820 - dStack_1970;
  local_638._0_8_ = local_1828 - local_1978;
  dVar45 = dVar45 / dVar72;
  local_628._8_8_ = dStack_1820 * dVar350 - dStack_1970 * dVar44;
  local_628._0_8_ = dVar44 - dVar350;
  local_618._8_8_ = local_1828 * dStack_1970 - local_1978 * dStack_1820;
  local_618._0_8_ = dVar44 * local_1978 - dVar350 * local_1828;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_4c8._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_4c8._8_8_;
  auVar168._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_4c8,(scalar_sum_op<double,_double> *)local_ab8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_3a8);
  auVar168._8_8_ = 0;
  auVar120 = sqrtpd(auVar168,auVar168);
  auVar328._0_8_ = auVar120._0_8_;
  auVar328._8_8_ = auVar328._0_8_;
  local_638 = divpd(local_638,auVar328);
  local_628 = divpd(local_628,auVar328);
  local_618 = divpd(local_618,auVar328);
  local_19d8 = auVar337._0_8_;
  dStack_19d0 = auVar337._8_8_;
  local_1a48 = auVar305._0_8_;
  dStack_1a40 = auVar305._8_8_;
  local_4c8._8_8_ = local_668;
  local_668._8_8_ = dStack_19d0 - dStack_1a40;
  local_668._0_8_ = local_19d8 - local_1a48;
  local_658._8_8_ = dStack_19d0 * dVar26 - dStack_1a40 * dVar45;
  local_658._0_8_ = dVar45 - dVar26;
  local_648._8_8_ = local_19d8 * dStack_1a40 - local_1a48 * dStack_19d0;
  local_648._0_8_ = dVar45 * local_1a48 - dVar26 * local_19d8;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_4c8._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       (double)local_4c8._8_8_;
  auVar305._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)local_4c8,(scalar_sum_op<double,_double> *)local_ab8,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_3a8);
  auVar305._8_8_ = 0;
  auVar120 = sqrtpd(auVar305,auVar305);
  auVar337._0_8_ = auVar120._0_8_;
  auVar337._8_8_ = auVar337._0_8_;
  local_668 = divpd(local_668,auVar337);
  local_658 = divpd(local_658,auVar337);
  local_648 = divpd(local_648,auVar337);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       dVar300;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dVar319;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       dVar53;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dVar316;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       dVar335;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dVar73;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       dVar81;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dVar280;
  getPredefinedTransformations1Plane3Line<double>(&local_a10,&local_58,&local_78,false);
  lVar39 = 0x10;
  pMVar33 = local_a10.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  pMVar34 = &local_138;
  for (lVar31 = 0x10; lVar31 != 0; lVar31 = lVar31 + -1) {
    (pMVar34->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar33 = (pointer)((long)pMVar33 + ((ulong)bVar40 * -2 + 1) * 8);
    pMVar34 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar34 + ((ulong)bVar40 * -2 + 1) * 8);
  }
  local_a10.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_a10.
       super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  pMVar1 = (XprTypeNested)(local_288 + 0xa0);
  pMVar33 = local_a10.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar35 = pMVar1;
  for (lVar31 = 0x10; lVar31 != 0; lVar31 = lVar31 + -1) {
    (pMVar35->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar33->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar33 = (pointer)((long)pMVar33 + ((ulong)bVar40 * -2 + 1) * 8);
    pMVar35 = (XprTypeNested)((long)pMVar35 + ((ulong)bVar40 * -2 + 1) * 8);
  }
  memset(&local_3a8,0,0x120);
  pdVar28 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 2;
  do {
    dVar26 = *(double *)(local_288 + lVar39 + 0x98);
    ((plain_array<double,_36,_0,_16> *)(pdVar28 + -2))->array[0] =
         *(double *)(local_288 + lVar39 + 0x90);
    pdVar28[-1] = dVar26;
    *pdVar28 = *(double *)
                ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                       m_storage.m_data.array + lVar39 + -0x80);
    lVar39 = lVar39 + 0x20;
    pdVar28 = pdVar28 + 6;
  } while (lVar39 != 0x70);
  lVar31 = 8;
  pdVar28 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 0x16;
  do {
    pdVar28[-1] = *(double *)(local_288 + lVar31 + 0x98);
    dVar26 = *(double *)
              ((long)(&local_168)[-3].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                     m_storage.m_data.array + lVar31);
    *pdVar28 = *(double *)
                ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                       m_storage.m_data.array + lVar31 + -0x80);
    pdVar28[1] = dVar26;
    lVar31 = lVar31 + 0x20;
    pdVar28 = pdVar28 + 6;
  } while (lVar31 != 0x68);
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       adStack_1e0[0xb];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       adStack_1e0[0xc];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       adStack_1e0[0xd];
  getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)local_288,&local_98);
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 3);
  vStack_a70.m_value = 0;
  vStack_a68.m_value = 0;
  local_aa8.m_other = -1.0;
  local_a88.m_value = 3;
  vStack_a80.m_value = 3;
  dStack_a60 = 1.97626258336499e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  pMStack_aa0 = (Matrix<double,_6,_6,_0,_6,_6> *)local_288;
  pMStack_a90 = pMVar1;
  local_a78 = pMVar1;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_3a8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_548,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_ab8,(assign_op<double,_double> *)&local_168,(type)0x0);
  memset((Matrix<double,_6,_6,_0,_6,_6> *)local_4c8,0,0x120);
  lVar31 = 0x10;
  puVar32 = (undefined8 *)(local_4c8 + 0x10);
  do {
    uVar27 = *(undefined8 *)((long)&dStack_140 + lVar31);
    puVar32[-2] = *(undefined8 *)
                   ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array + lVar31 + 0x20);
    puVar32[-1] = uVar27;
    *puVar32 = *(undefined8 *)
                ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar31);
    lVar31 = lVar31 + 0x20;
    puVar32 = puVar32 + 6;
  } while (lVar31 != 0x70);
  lVar31 = 8;
  pdVar28 = &local_418;
  do {
    pdVar28[-1] = *(double *)((long)&dStack_140 + lVar31);
    dVar26 = *(double *)
              ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + lVar31 + 8);
    *pdVar28 = *(double *)
                ((long)local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar31);
    pdVar28[1] = dVar26;
    lVar31 = lVar31 + 0x20;
    pdVar28 = pdVar28 + 6;
  } while (lVar31 != 0x68);
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_138.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)local_288,&local_b8);
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_4c8 + 0x18);
  vStack_a70.m_value = 0;
  vStack_a68.m_value = 0;
  local_aa8.m_other = -1.0;
  pMStack_a90 = &local_138;
  local_a88.m_value = 3;
  vStack_a80.m_value = 3;
  dStack_a60 = 1.97626258336499e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  pMStack_aa0 = (Matrix<double,_6,_6,_0,_6,_6> *)local_288;
  local_a78 = pMStack_a90;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)local_4c8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_548,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_ab8,(assign_op<double,_double> *)&local_168,(type)0x0);
  dVar247 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1e] * (double)local_558._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x18] * (double)local_558._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x12] * (double)local_568._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xc] * (double)local_568._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[6] * (double)local_578._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0] * (double)local_578._0_8_;
  dVar267 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1f] * (double)local_558._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x19] * (double)local_558._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x13] * (double)local_568._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xd] * (double)local_568._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[7] * (double)local_578._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[1] * (double)local_578._0_8_;
  dVar276 = (double)local_558._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x20] +
            (double)local_558._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1a] +
            (double)local_568._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x14] +
            (double)local_568._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xe] +
            (double)local_578._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[8] +
            (double)local_578._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[2];
  dVar286 = (double)local_558._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x21] +
            (double)local_558._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1b] +
            (double)local_568._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x15] +
            (double)local_568._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xf] +
            (double)local_578._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[9] +
            (double)local_578._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[3];
  dVar26 = (double)local_558._8_8_ *
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x22] +
           (double)local_558._0_8_ *
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1c] +
           (double)local_568._8_8_ *
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x16] +
           (double)local_568._0_8_ *
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x10] +
           (double)local_578._8_8_ *
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[10] +
           (double)local_578._0_8_ *
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[4];
  dVar313 = (double)local_558._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x23] +
            (double)local_558._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1d] +
            (double)local_568._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x17] +
            (double)local_568._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x11] +
            (double)local_578._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xb] +
            (double)local_578._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[5];
  auVar4._8_4_ = SUB84(dVar313,0);
  auVar4._0_8_ = dVar26;
  auVar4._12_4_ = (int)((ulong)dVar313 >> 0x20);
  dVar46 = local_3d8 * (double)local_5e8._8_8_ +
           local_408 * (double)local_5e8._0_8_ +
           local_438 * (double)local_5f8._8_8_ +
           local_468 * (double)local_5f8._0_8_ +
           local_498 * (double)local_608._8_8_ + (double)local_4c8._0_8_ * (double)local_608._0_8_;
  dVar79 = dStack_3d0 * (double)local_5e8._8_8_ +
           dStack_400 * (double)local_5e8._0_8_ +
           dStack_430 * (double)local_5f8._8_8_ +
           dStack_460 * (double)local_5f8._0_8_ +
           dStack_490 * (double)local_608._8_8_ + (double)local_4c8._8_8_ * (double)local_608._0_8_;
  dVar91 = (double)local_5e8._8_8_ * local_3c8 +
           (double)local_5e8._0_8_ * local_3f8 +
           (double)local_5f8._8_8_ * local_428 +
           (double)local_5f8._0_8_ * local_458 +
           (double)local_608._8_8_ * local_488 + (double)local_608._0_8_ * (double)local_4c8._16_8_;
  dVar126 = (double)local_5e8._8_8_ * dStack_3c0 +
            (double)local_5e8._0_8_ * dStack_3f0 +
            (double)local_5f8._8_8_ * dStack_420 +
            (double)local_5f8._0_8_ * dStack_450 +
            (double)local_608._8_8_ * dStack_480 +
            (double)local_608._0_8_ * (double)local_4c8._24_8_;
  dVar297 = (double)local_5e8._8_8_ * local_3b8 +
            (double)local_5e8._0_8_ * local_3e8 +
            (double)local_5f8._8_8_ * local_418 +
            (double)local_5f8._0_8_ * local_448 +
            (double)local_608._8_8_ * local_478 + (double)local_608._0_8_ * local_4a8;
  dVar306 = (double)local_5e8._8_8_ * dStack_3b0 +
            (double)local_5e8._0_8_ * dStack_3e0 +
            (double)local_5f8._8_8_ * dStack_410 +
            (double)local_5f8._0_8_ * dStack_440 +
            (double)local_608._8_8_ * dStack_470 + (double)local_608._0_8_ * dStack_4a0;
  dVar313 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1e] * (double)local_588._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x18] * (double)local_588._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x12] * (double)local_598._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xc] * (double)local_598._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[6] * (double)local_5a8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0] * (double)local_5a8._0_8_;
  dVar275 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1f] * (double)local_588._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x19] * (double)local_588._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x13] * (double)local_598._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xd] * (double)local_598._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[7] * (double)local_5a8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[1] * (double)local_5a8._0_8_;
  auVar5._8_4_ = SUB84(dVar275,0);
  auVar5._0_8_ = dVar313;
  auVar5._12_4_ = (int)((ulong)dVar275 >> 0x20);
  dVar298 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x20] * (double)local_588._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1a] * (double)local_588._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x14] * (double)local_598._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xe] * (double)local_598._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[8] * (double)local_5a8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[2] * (double)local_5a8._0_8_;
  dVar307 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x21] * (double)local_588._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1b] * (double)local_588._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x15] * (double)local_598._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xf] * (double)local_598._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[9] * (double)local_5a8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[3] * (double)local_5a8._0_8_;
  dVar248 = (double)local_588._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x22] +
            (double)local_588._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1c] +
            (double)local_598._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x16] +
            (double)local_598._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x10] +
            (double)local_5a8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[10] +
            (double)local_5a8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[4];
  dVar268 = (double)local_588._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x23] +
            (double)local_588._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1d] +
            (double)local_598._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x17] +
            (double)local_598._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x11] +
            (double)local_5a8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xb] +
            (double)local_5a8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[5];
  dVar275 = local_3d8 * (double)local_618._8_8_ +
            local_408 * (double)local_618._0_8_ +
            local_438 * (double)local_628._8_8_ +
            local_468 * (double)local_628._0_8_ +
            local_498 * (double)local_638._8_8_ + (double)local_4c8._0_8_ * (double)local_638._0_8_;
  dVar349 = dStack_3d0 * (double)local_618._8_8_ +
            dStack_400 * (double)local_618._0_8_ +
            dStack_430 * (double)local_628._8_8_ +
            dStack_460 * (double)local_628._0_8_ +
            dStack_490 * (double)local_638._8_8_ + (double)local_4c8._8_8_ * (double)local_638._0_8_
  ;
  auVar6._8_4_ = SUB84(dVar349,0);
  auVar6._0_8_ = dVar275;
  auVar6._12_4_ = (int)((ulong)dVar349 >> 0x20);
  dVar299 = local_3c8 * (double)local_618._8_8_ +
            local_3f8 * (double)local_618._0_8_ +
            local_428 * (double)local_628._8_8_ +
            local_458 * (double)local_628._0_8_ +
            local_488 * (double)local_638._8_8_ + (double)local_4c8._16_8_ * (double)local_638._0_8_
  ;
  dVar308 = dStack_3c0 * (double)local_618._8_8_ +
            dStack_3f0 * (double)local_618._0_8_ +
            dStack_420 * (double)local_628._8_8_ +
            dStack_450 * (double)local_628._0_8_ +
            dStack_480 * (double)local_638._8_8_ +
            (double)local_4c8._24_8_ * (double)local_638._0_8_;
  dVar47 = (double)local_618._8_8_ * local_3b8 +
           (double)local_618._0_8_ * local_3e8 +
           (double)local_628._8_8_ * local_418 +
           (double)local_628._0_8_ * local_448 +
           (double)local_638._8_8_ * local_478 + (double)local_638._0_8_ * local_4a8;
  dVar80 = (double)local_618._8_8_ * dStack_3b0 +
           (double)local_618._0_8_ * dStack_3e0 +
           (double)local_628._8_8_ * dStack_410 +
           (double)local_628._0_8_ * dStack_440 +
           (double)local_638._8_8_ * dStack_470 + (double)local_638._0_8_ * dStack_4a0;
  dVar349 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1e] * (double)local_5b8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x18] * (double)local_5b8._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x12] * (double)local_5c8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xc] * (double)local_5c8._0_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[6] * (double)local_5d8._8_8_ +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0] * (double)local_5d8._0_8_;
  dVar44 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * (double)local_5b8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * (double)local_5b8._0_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * (double)local_5c8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * (double)local_5c8._0_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * (double)local_5d8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * (double)local_5d8._0_8_;
  auVar7._8_4_ = SUB84(dVar44,0);
  auVar7._0_8_ = dVar349;
  auVar7._12_4_ = (int)((ulong)dVar44 >> 0x20);
  dVar44 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * (double)local_5b8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * (double)local_5b8._0_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * (double)local_5c8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * (double)local_5c8._0_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * (double)local_5d8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * (double)local_5d8._0_8_;
  dVar42 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x21] * (double)local_5b8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * (double)local_5b8._0_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * (double)local_5c8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * (double)local_5c8._0_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[9] * (double)local_5d8._8_8_ +
           local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * (double)local_5d8._0_8_;
  dVar249 = (double)local_5b8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x22] +
            (double)local_5b8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1c] +
            (double)local_5c8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x16] +
            (double)local_5c8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x10] +
            (double)local_5d8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[10] +
            (double)local_5d8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[4];
  dVar269 = (double)local_5b8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x23] +
            (double)local_5b8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1d] +
            (double)local_5c8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x17] +
            (double)local_5c8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x11] +
            (double)local_5d8._8_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xb] +
            (double)local_5d8._0_8_ *
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[5];
  dVar250 = local_3d8 * (double)local_648._8_8_ +
            local_408 * (double)local_648._0_8_ +
            local_438 * (double)local_658._8_8_ +
            local_468 * (double)local_658._0_8_ +
            local_498 * (double)local_668._8_8_ + (double)local_4c8._0_8_ * (double)local_668._0_8_;
  dVar270 = dStack_3d0 * (double)local_648._8_8_ +
            dStack_400 * (double)local_648._0_8_ +
            dStack_430 * (double)local_658._8_8_ +
            dStack_460 * (double)local_658._0_8_ +
            dStack_490 * (double)local_668._8_8_ + (double)local_4c8._8_8_ * (double)local_668._0_8_
  ;
  dVar251 = local_3c8 * (double)local_648._8_8_ +
            local_3f8 * (double)local_648._0_8_ +
            local_428 * (double)local_658._8_8_ +
            local_458 * (double)local_658._0_8_ +
            local_488 * (double)local_668._8_8_ + (double)local_4c8._16_8_ * (double)local_668._0_8_
  ;
  dStack_e00 = dStack_3c0 * (double)local_648._8_8_ +
               dStack_3f0 * (double)local_648._0_8_ +
               dStack_420 * (double)local_658._8_8_ +
               dStack_450 * (double)local_658._0_8_ +
               dStack_480 * (double)local_668._8_8_ +
               (double)local_4c8._24_8_ * (double)local_668._0_8_;
  local_e08 = (double)local_648._8_8_ * local_3b8 +
              (double)local_648._0_8_ * local_3e8 +
              (double)local_658._8_8_ * local_418 +
              (double)local_658._0_8_ * local_448 +
              (double)local_668._8_8_ * local_478 + (double)local_668._0_8_ * local_4a8;
  dVar169 = (double)local_648._8_8_ * dStack_3b0 +
            (double)local_648._0_8_ * dStack_3e0 +
            (double)local_658._8_8_ * dStack_410 +
            (double)local_658._0_8_ * dStack_440 +
            (double)local_668._8_8_ * dStack_470 + (double)local_668._0_8_ * dStack_4a0;
  auVar8._8_4_ = SUB84(dVar169,0);
  auVar8._0_8_ = local_e08;
  auVar8._12_4_ = (int)((ulong)dVar169 >> 0x20);
  local_ce8 = dVar276 * dVar268;
  dVar92 = dVar267 + dVar267;
  dStack_1690 = auVar4._8_8_;
  dStack_1a40 = auVar7._8_8_;
  dVar48 = dStack_1690 + dStack_1690;
  dVar139 = -(dVar48 * dVar298);
  dStack_1860 = auVar5._8_8_;
  dVar49 = dStack_1690 * dVar298;
  dVar178 = dVar49 * dVar44 * dVar91;
  dVar179 = dVar276 + dVar276;
  dVar43 = dVar26 + dVar26;
  dVar93 = dVar179 * dVar268;
  dVar127 = dVar179 * dVar298;
  dVar180 = dVar298 * dVar92;
  dVar207 = dVar248 * dVar179;
  dVar140 = dVar276 * dVar298;
  dStack_b70 = dVar286 * dVar307;
  dVar277 = dVar180 * dVar349;
  dStack_19e0 = auVar6._8_8_;
  dVar141 = dVar276 * dVar307;
  dVar278 = dVar126 * dVar180 * dVar44;
  local_928 = dStack_19e0 * dVar278;
  dVar181 = dVar247 * 4.0;
  dVar182 = dVar181 * dVar298;
  dVar279 = dStack_1a40 * -dVar182;
  dVar252 = dVar126 * dVar277 * dStack_19e0;
  dStack_f60 = dVar179 * dStack_1860;
  dVar242 = dStack_f60 * dVar44;
  dVar94 = dStack_1a40 * dVar140;
  dVar253 = dVar127 * dVar44;
  dVar287 = dVar299 * dVar91 * dVar48 * dVar313 * dVar44;
  local_958 = dVar80 * -(dVar46 * dVar253);
  dStack_950 = dVar275 * dVar349 * dVar139 * dVar91;
  dVar142 = dVar180 * dVar44 * dVar91;
  dVar183 = dVar247 * 2.0;
  dVar208 = dVar276 * 4.0;
  dVar184 = dVar183 * dVar298;
  dVar340 = dVar183 * dStack_1860;
  dVar169 = dVar247 * dVar313 * dStack_1a40;
  dVar185 = dVar126 * dVar169 * dVar299;
  dVar143 = -dVar340 * dVar249 * dVar91 * dVar299;
  dVar170 = dVar169 * dVar91 * dVar308;
  dVar95 = dVar179 * dVar313;
  dVar128 = dVar43 * dStack_1860;
  dVar96 = dVar208 * dVar313;
  dVar97 = dVar43 * dVar298;
  dVar129 = dVar208 * dStack_1860;
  dVar144 = dVar140 * dVar349;
  local_b78 = dVar144 * dVar306 * dStack_19e0;
  local_688 = -local_b78;
  dVar209 = dVar46 * dStack_f60 * dStack_1a40;
  local_b88 = dStack_f60 * dStack_1a40 * dVar79;
  dVar338 = dVar184 * dStack_1a40;
  dVar210 = dVar91 * dVar338;
  dStack_680 = local_b88 * dVar299;
  dStack_670 = -dStack_680;
  local_678 = dVar340 * dVar269 * dVar91 * dVar299;
  dVar217 = dVar286 * 2.0;
  dVar81 = dVar267 * 4.0;
  dVar98 = dVar286 * 4.0;
  dVar300 = -(dVar26 * 4.0);
  dVar169 = dVar313 * dVar300;
  auVar9._8_4_ = SUB84(dVar169,0);
  auVar9._0_8_ = dVar127;
  auVar9._12_4_ = (int)((ulong)dVar169 >> 0x20);
  dVar179 = dVar179 * dVar307;
  dVar145 = dVar92 * dVar313;
  dStack_7f0 = dVar267 * dVar298;
  dVar211 = dVar81 * dStack_1860 * dVar44;
  dVar169 = dVar145 * dVar44;
  dVar45 = -(dVar267 * dVar307) * dVar44;
  auVar10._8_4_ = SUB84(dVar45,0);
  auVar10._0_8_ = dVar169;
  auVar10._12_4_ = (int)((ulong)dVar45 >> 0x20);
  dVar186 = dVar179 * dStack_1a40 * dVar46;
  dVar50 = dStack_1860 * dVar276;
  dStack_c80 = dVar248 * dVar92;
  dVar187 = dVar276 * dVar313;
  dStack_be0 = dVar92 * dStack_1860;
  dVar188 = dVar187 * dStack_1a40;
  dVar212 = dStack_be0 * dVar44;
  dVar218 = -(dVar127 * dStack_1a40);
  local_b98 = -dVar98 * dVar298 * dStack_1a40 * dVar79 * dStack_19e0;
  dStack_b90 = dVar212 * dVar297 * dVar299;
  dVar99 = dVar183 * dVar313 * dVar44;
  dVar254 = dVar308 * dVar91 * dVar99;
  dStack_790 = dVar126 * dVar99 * dVar299;
  dVar255 = dVar254 * dVar250;
  dVar45 = dVar184 * dVar349;
  dVar72 = dVar247 * dVar313 * dVar44;
  auVar11._8_4_ = SUB84(dVar72,0);
  auVar11._0_8_ = dVar45;
  auVar11._12_4_ = (int)((ulong)dVar72 >> 0x20);
  dVar333 = dVar179 * dVar44 * dVar79 * dStack_19e0;
  dVar280 = dVar217 * dVar298;
  dVar72 = dVar280 * dVar349;
  dVar335 = -dVar81 * dVar307 * dVar44;
  auVar12._8_4_ = SUB84(dVar335,0);
  auVar12._0_8_ = dVar72;
  auVar12._12_4_ = (int)((ulong)dVar335 >> 0x20);
  dStack_1780 = auVar9._8_8_;
  dVar335 = dVar127 * dVar349;
  auVar13._8_4_ = SUB84(dStack_1780 * dVar44,0);
  auVar13._0_8_ = dVar335;
  auVar13._12_4_ = (int)((ulong)(dStack_1780 * dVar44) >> 0x20);
  local_ba8 = dVar218 * dVar46 * dStack_19e0;
  dStack_ba0 = dVar188 * dVar79 * dVar299;
  dVar100 = dVar349 * dVar92 * dVar307 * dVar91 * dStack_19e0;
  dVar130 = dVar44 * dVar286 * dStack_1860 * dVar46 * dVar299;
  dVar314 = dStack_19e0 * dVar186;
  local_798 = dVar299 * dVar169 * dVar297;
  dStack_1910 = auVar11._8_8_;
  dVar256 = dVar275 * dVar91 * dVar45 * dStack_e00;
  local_7b8 = dVar126 * dVar45;
  dVar257 = dVar275 * local_7b8 * dVar251;
  dVar51 = dVar97 * dVar44 * dVar46;
  local_968 = dStack_19e0 * dVar51;
  dStack_960 = dVar299 * dVar129 * dVar249 * dVar79;
  dVar52 = dVar340 * dVar44;
  dVar53 = dVar26 * 4.0 * dVar298;
  dVar73 = dVar97 * dStack_1a40;
  dVar350 = dVar95 * dVar44;
  dVar341 = dVar349 * -dVar129;
  auVar14._8_4_ = SUB84(dVar350,0);
  auVar14._0_8_ = dVar73;
  auVar14._12_4_ = (int)((ulong)dVar350 >> 0x20);
  dVar219 = dVar95 * dStack_1a40;
  dStack_690 = -dVar209 * dVar47;
  local_988 = -(dVar247 * dVar268) * dStack_1a40 * dVar91 * dVar299;
  dStack_980 = dVar128 * dVar44 * dVar46 * dVar299;
  local_698 = -dStack_980;
  dVar220 = dVar140 * dVar44;
  local_6e8 = dVar46 * dVar220;
  local_9b8 = dVar79 * dVar220;
  local_998 = dVar275 * dVar220 * dVar306;
  dStack_990 = dStack_19e0;
  local_978 = dVar275 * dVar79 * dVar73;
  dVar320 = dVar299 * dVar306 * dVar350;
  dVar321 = dVar247 * dVar298;
  dVar315 = dVar43 * dVar313 * dVar44;
  dVar322 = dVar180 * dStack_1a40;
  local_be8 = dVar187 * dVar269 * dVar79 * dVar299;
  local_6d8 = -local_be8;
  local_bb8 = dVar300 * dStack_1860 * dVar44 * dVar46 * dVar299;
  dStack_6d0 = dStack_19e0 * dVar322 * dVar297;
  dStack_bb0 = -dStack_6d0;
  local_6c8 = dVar46 * dVar341;
  dVar288 = dVar81 * dVar298;
  dVar221 = dVar313 * -dVar81 * dVar44;
  dStack_6b0 = dVar221 * dVar91 * dVar47;
  dVar101 = dVar179 * dVar349 * dVar79;
  local_bd8 = dStack_19e0 * dVar101;
  local_6b8 = -local_bd8;
  dStack_6a0 = dVar322 * dVar297 * dVar275;
  dVar102 = dVar217 * dVar313 * dVar44;
  dVar131 = -(dVar26 * dVar313) * dVar44;
  local_9a8 = dVar102 * dVar79 * dVar299;
  dStack_9a0 = dVar131 * dVar79 * dVar299;
  local_6a8 = -local_9a8;
  dStack_860 = dVar313 * dVar267;
  dVar103 = dVar247 * dStack_1860;
  dVar54 = dVar286 * dVar298;
  local_818 = dVar54 * dVar349;
  local_788 = dVar267 * dStack_1860 * dVar349;
  dVar104 = dVar276 * dVar248;
  dVar105 = dVar26 * dVar298;
  local_db8 = dStack_1a40 * dVar145;
  dStack_db0 = dVar349 * dStack_7f0;
  dStack_840 = -dVar286;
  local_848 = -(dVar286 * dVar313) * dVar44;
  local_7c8 = dVar103 * dVar249;
  local_778 = dVar267 * dStack_1860 * dVar44;
  local_738 = dVar26 * dStack_1860 * dVar44;
  dStack_730 = dStack_1690;
  local_768 = dVar187 * dVar249;
  local_808 = dVar181 * dVar313 * dVar44;
  dVar55 = dVar181 * dStack_1860 * dVar44;
  dStack_7d0 = -dVar267;
  local_7d8 = -dVar181 * dVar307 * dVar44;
  local_7a8 = dVar98 * dVar313 * dVar44;
  local_e98 = dVar98 * dStack_1860 * dVar44;
  dVar56 = -dVar50;
  dStack_7e0 = -dStack_c80;
  dVar106 = dVar349 * dVar56;
  local_7e8 = dVar56 * dVar249;
  dVar213 = -dVar321;
  auVar124._8_4_ = SUB84(dVar321,0);
  auVar124._0_8_ = dVar213;
  auVar124._12_4_ = (int)((ulong)dVar213 >> 0x20);
  uStack_880 = auVar124._8_8_;
  local_888 = dVar213 * dVar249;
  local_868 = dStack_860 * dVar249;
  local_7f8 = dStack_7f0 * dVar249;
  dVar289 = dStack_f60 * dVar42;
  local_9c8 = -dVar208 * dVar248 * dVar349;
  dStack_9c0 = -dVar183 * dVar268 * dStack_1a40;
  local_838 = dVar50 * dStack_1a40;
  dVar57 = dVar183 * dVar313 * dStack_1a40;
  local_c38 = dVar91 * dVar184 * dVar44;
  uVar296 = (undefined4)((ulong)dVar79 >> 0x20);
  local_828 = dVar46 * dVar207 * dVar349;
  dVar41 = dVar207 * dVar349 * dVar79;
  local_9d8 = dVar275 * dVar41;
  dStack_9d0 = dStack_19e0 * dVar288 * dVar349 * dVar91;
  dVar107 = dVar217 * dStack_1860 * dVar44;
  local_898 = dVar46 * dVar96 * dStack_1a40;
  local_8b8 = dVar79 * dVar280 * dVar44;
  dStack_8b0 = dVar91 * dVar103 * dVar44;
  local_bf8 = dVar275 * local_8b8;
  dStack_bf0 = dVar299 * dStack_8b0;
  dStack_6f0 = dVar81 * dVar248 * dVar44 * dVar91 * dVar275;
  dVar329 = dVar79 * dVar105 * dVar44;
  dVar222 = dVar280 * dStack_1a40 * dVar46;
  local_748 = dStack_19e0 * dVar222;
  local_6f8 = -local_748;
  dVar342 = dVar50 * dVar44;
  dVar258 = dVar207 * dVar44;
  dVar58 = dVar91 * dVar277;
  dVar146 = dVar207 * dStack_1a40 * dVar46;
  local_9f8 = dVar275 * dVar146;
  dStack_9f0 = dStack_19e0 * dVar104 * dStack_1a40 * dVar46;
  dStack_700 = -(dVar277 * dVar297) * dStack_19e0;
  local_708 = -local_9f8;
  local_878 = dVar79 * dVar342 * dVar47;
  dStack_bd0 = -local_878;
  dVar81 = dVar46 * dVar140 * dVar249 * dStack_19e0;
  local_858._8_4_ = SUB84(dVar79,0);
  local_858._0_8_ = dVar81;
  local_858._12_4_ = uVar296;
  dVar189 = dVar26 * dVar313 * dStack_1a40 * dVar79 * dVar299;
  dStack_750 = -dVar189;
  local_758 = dVar79 * dVar217 * dVar313 * dStack_1a40 * dVar299;
  dStack_710 = dVar126 * dVar288 * dStack_1a40 * dStack_19e0;
  dVar59 = dVar275 * dVar79 * dVar280 * dStack_1a40;
  dVar82 = dStack_19e0 * dVar329;
  dVar329 = dVar329 * dVar275;
  dStack_740 = -dVar329;
  dVar271 = dVar79 * dVar127 * dStack_1a40;
  local_9e8 = dVar299 * dVar79 * dVar93 * dVar44;
  dStack_9e0 = dVar80 * dVar271;
  dVar83 = -dVar321 * dStack_1a40 * dVar91;
  dVar84 = dVar184 * dVar249 * dVar91;
  dVar132 = dVar91 * dStack_c80 * dVar44;
  dVar60 = dVar79 * dVar127 * dVar249 * dVar275;
  dVar85 = dVar46 * dVar342 * dVar47;
  dVar324 = -dStack_860 * dVar44;
  dVar316 = dVar349 * dVar145 * dVar91;
  dVar190 = dVar267 * dVar248 * dVar349 * dVar91 * dStack_19e0;
  dStack_8d0 = -dVar190;
  dVar61 = -(dVar267 * dVar248) * dVar44 * dVar91 * dStack_19e0;
  dVar280 = dStack_1690 * dVar313 * dStack_1a40 * dVar91;
  auVar15._8_4_ = SUB84(-dVar242 * dVar79,0);
  auVar15._0_8_ = dVar280;
  auVar15._12_4_ = (int)((ulong)(-dVar242 * dVar79) >> 0x20);
  dVar300 = -(dStack_1690 * dStack_1860) * dVar349 * dVar91;
  dVar319 = -dStack_f60 * dVar269 * dVar79;
  auVar16._8_4_ = SUB84(dVar319,0);
  auVar16._0_8_ = dVar300;
  auVar16._12_4_ = (int)((ulong)dVar319 >> 0x20);
  dStack_1780 = auVar13._8_8_;
  local_8d8 = dStack_19e0 * dVar46 * dVar335;
  local_728 = dVar53 * dVar349 * dVar46 * dVar275;
  dStack_720 = -dVar335 * dVar79 * dVar275;
  dVar259 = dVar47 * dVar316;
  dVar272 = dVar299 * dVar42 * dStack_860 * dVar91;
  local_ee8 = dVar91 * dVar324;
  dStack_ee0 = dVar79 * dVar349 * dVar97;
  dVar108 = -dVar316 * dVar299;
  local_8a8 = local_e08 * local_8d8;
  dStack_8a0 = dVar250 * dVar299 * dVar46 * dStack_1780;
  dVar325 = dVar46 * dVar95 * dVar349;
  dVar260 = dVar219 * dVar46;
  dVar273 = dVar95 * dVar349 * dVar79;
  dVar223 = dVar299 * dVar273;
  dVar62 = dVar103 * dStack_1a40 * dVar91;
  dVar261 = dVar299 * dVar62;
  dStack_900 = -dVar261;
  local_908 = -dVar223;
  local_e88 = dStack_19e0 * dVar53 * dStack_1a40 * dVar46;
  dStack_e80 = dVar299 * -dVar350 * dVar46;
  dStack_1130 = auVar14._8_8_;
  dStack_1030 = auVar12._8_8_;
  dVar319 = dStack_1130 * dVar79;
  dVar53 = dVar247 * dVar248 * dVar44 * dVar91;
  auVar17._8_4_ = SUB84(dVar53,0);
  auVar17._0_8_ = dVar319;
  auVar17._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dVar63 = -(dVar179 * dVar44) * dVar46 * dStack_19e0;
  dVar86 = dVar94 * dVar79 * dVar275;
  dVar334 = dVar44 * dVar92 * dVar307 * dVar91;
  dVar344 = dVar184 * dVar42 * dVar91;
  dVar345 = dVar344 * dStack_19e0;
  dVar348 = dVar322 * dVar126 * dVar275;
  dVar53 = dStack_19e0 * dVar334;
  dVar316 = dVar275 * -dVar54 * dStack_1a40 * dVar46;
  auVar18._8_4_ = SUB84(dVar316,0);
  auVar18._0_8_ = dVar53;
  auVar18._12_4_ = (int)((ulong)dVar316 >> 0x20);
  local_cb8 = dVar306 * dVar219 * dVar299;
  dStack_cb0 = dVar79 * dVar128 * dVar44 * dVar299;
  dStack_8c0 = -dStack_cb0;
  local_8f8._8_4_ = SUB84(dVar79,0);
  local_8f8._0_8_ = dVar79 * dVar106;
  local_8f8._12_4_ = uVar296;
  dVar64 = dVar106 * dVar306 * dVar299;
  dVar316 = dVar249 * dVar180 * dVar91;
  dVar281 = dVar275 * dVar316;
  dVar290 = dVar299 * dVar349 * dVar286 * dStack_1860 * dVar46;
  dVar316 = dVar316 * dStack_19e0;
  local_8e8._8_4_ = SUB84(dVar316,0);
  local_8e8._0_8_ = dVar64;
  local_8e8._12_4_ = (uint)((ulong)dVar316 >> 0x20) ^ 0x80000000;
  local_f88 = dVar299 * dVar79 * dVar315;
  dStack_f80 = dStack_19e0 * dVar91 * dVar322;
  dVar109 = dVar46 * dVar140 * dVar42 * dStack_19e0;
  dStack_1060 = -dVar109;
  dVar216 = dVar141 * dVar44 * dVar79 * dVar275;
  dStack_920 = -dVar216;
  dVar65 = dVar183 * dVar307 * dVar44 * dVar91;
  dVar110 = dVar275 * dVar65;
  local_918 = -dVar110;
  dStack_1160 = auVar10._8_8_;
  dVar66 = dVar91 * dVar169;
  dVar147 = dVar308 * dVar66;
  dVar171 = dVar275 * dVar91 * dStack_1160;
  local_f58 = -dVar66 * dVar299;
  dStack_f50 = dVar46 * dVar335 * dVar80;
  dVar43 = dVar299 * -(dVar43 * dVar313) * dStack_1a40 * dVar46;
  dVar192 = dVar80 * dVar83;
  auVar19._8_4_ = SUB84(dVar192,0);
  auVar19._0_8_ = dVar43;
  auVar19._12_4_ = (int)((ulong)dVar192 >> 0x20);
  dVar67 = -(local_ce8 * dVar44) * dVar46 * dVar299;
  dVar87 = dVar180 * dVar269 * dVar91 * dStack_19e0;
  local_f08 = dVar48 * dVar313 * dStack_1a40 * dVar91 * dVar299;
  dStack_f00 = dVar218 * dVar306 * dStack_19e0;
  dVar218 = dVar107 * dVar79 * dVar299;
  dVar68 = -(dVar217 * dStack_1860) * dVar349 * dVar79 * dVar299;
  dVar69 = dVar297 * dStack_7f0 * dVar44;
  dVar148 = dVar275 * dVar69;
  dVar70 = dVar79 * dVar289 * dVar299;
  dVar69 = dVar69 * dStack_19e0;
  dVar224 = dVar79 * dVar219 * dVar299;
  dVar83 = dVar83 * dStack_19e0;
  dVar71 = dVar299 * dVar46 * dVar342;
  dVar88 = dStack_19e0 * dVar132;
  dVar191 = dVar275 * dVar344 * dVar250;
  dVar110 = dVar110 * dVar250;
  dVar111 = dVar299 * dVar325 * dStack_e00;
  dVar326 = dVar325 * dVar308 * dVar251;
  dVar325 = dVar42 * dVar95 * dVar46 * dVar299 * dVar250;
  dVar344 = dVar46 * dVar179 * dVar349 * dVar275 * dVar251;
  local_cd8 = dVar46 * dVar102 * dVar299;
  dStack_cd0 = dVar79 * dVar131 * dVar308;
  dVar262 = dVar275 * dVar46 * dVar72 * dVar251;
  dVar102 = -dVar57 * dVar91 * dVar47 * dVar251;
  dVar149 = dVar297 * dVar57 * dVar299 * dVar251;
  dVar57 = dVar91 * dVar99 * dVar47 * dVar270;
  dVar99 = dVar99 * dVar297 * dVar299 * dVar270;
  dVar150 = dVar91 * dVar340 * dVar349 * dVar299 * local_e08;
  dVar225 = -(dVar340 * dVar349) * dVar297 * dVar299 * dVar251;
  dVar192 = dVar340 * dStack_1a40 * dVar91;
  dVar193 = -dVar192 * dVar299 * dStack_e00;
  dVar151 = dVar308 * dVar192 * dVar251;
  dVar226 = dVar91 * dVar52;
  local_d78 = dVar47 * dVar226;
  local_e28 = dVar126 * dVar52 * dVar299;
  dVar152 = dVar308 * dVar226 * dVar270;
  dVar317 = dVar52 * dVar297 * dVar299 * dVar250;
  dVar192 = dVar340 * dVar42 * dVar91 * dVar299 * dVar270;
  dStack_de0 = dStack_19e0 * dVar91 * dVar45;
  dVar339 = dVar308 * dVar91 * dStack_1910;
  dVar227 = -dStack_1910 * dVar126 * dVar299;
  dVar45 = dVar45 * dVar297 * dStack_19e0;
  local_f78 = dStack_19e0 * dVar46 * dVar127 * dVar42;
  dStack_f70 = dStack_19e0 * dVar210;
  dVar89 = dVar91 * dVar103 * dVar349 * dVar299;
  dVar228 = dVar103 * dVar349 * dVar126 * dVar299;
  dVar217 = dVar184 * dVar44 * dVar297;
  dVar153 = dVar275 * dVar217;
  dVar172 = dStack_19e0 * -(dVar321 * dVar349) * dVar91;
  dVar229 = dStack_19e0 * dVar338 * dVar126;
  dVar243 = dVar299 * dVar103 * dVar44 * dVar126;
  dVar112 = dVar103 * dVar42 * dVar91 * dVar299;
  dVar301 = -dVar217 * dStack_19e0;
  dVar309 = dVar126 * dVar321 * dVar349 * dStack_19e0;
  dVar282 = dVar126 * -dVar321 * dStack_1a40 * dVar275;
  dVar230 = dVar126 * dVar321 * dVar44;
  dStack_930 = dStack_19e0 * dVar230;
  dVar131 = dStack_19e0 * -(dVar127 * dVar249) * dVar46;
  local_e18 = dStack_19e0 * dVar84;
  dVar84 = dVar84 * dVar275;
  dVar230 = dVar230 * dVar275;
  local_938 = -local_e18;
  dVar277 = dVar277 * dVar297 * dVar275;
  dVar90 = dVar140 * dVar42 * dVar79 * dVar275;
  dVar113 = dVar212 * dVar126 * dVar299;
  dVar133 = dVar42 * dVar56 * dVar46 * dVar299;
  local_de8 = -dVar113;
  dVar114 = dVar338 * dVar297 * dVar275;
  dVar154 = dVar44 * dVar248 * dVar183 * dVar91;
  dVar173 = dVar349 * dStack_860 * dVar91;
  dStack_fb0 = -(dVar46 * dVar72) * dStack_19e0;
  dVar340 = dVar91 * dStack_7f0 * dVar44;
  dVar56 = dVar289 * dVar46 * dVar299;
  local_fb8 = -dVar56;
  dVar115 = -dVar278 * dVar275;
  dVar134 = dVar46 * dVar141 * dVar44 * dVar275;
  dVar116 = dVar91 * dVar322 * dVar275;
  dVar135 = -dVar141 * dVar349 * dVar79 * dVar275;
  dVar334 = dVar334 * dVar275;
  dVar132 = dVar132 * dVar275;
  dVar327 = dVar248 * dVar183 * dStack_1a40 * dVar91 * dVar275;
  dVar330 = dVar247 * dVar307 * dVar44 * dVar91 * dVar275;
  local_ca8 = dVar73 * dVar46 * dVar275;
  dStack_ca0 = -dVar129 * dVar42 * dVar79 * dVar299;
  dStack_d80 = -local_ca8;
  local_d88 = dVar269 * -dStack_860 * dVar91 * dVar299;
  dVar278 = dVar247 * dVar268 * dVar44 * dVar91 * dVar299;
  local_d98 = -dVar278;
  local_da8 = dVar46 * dVar95 * dVar249;
  dStack_da0 = dVar79 * dVar128 * dVar269;
  dVar155 = dVar129 * dStack_1a40 * dVar79;
  dStack_d90 = dVar349 * dVar97 * dVar46 * dStack_19e0;
  dVar331 = dVar80 * dVar91 * dStack_db0;
  dVar217 = dVar91 * local_db8 * dVar299;
  dVar52 = dVar91 * dStack_db0 * dVar275;
  auVar20._8_4_ = SUB84(dVar52,0);
  auVar20._0_8_ = dVar217;
  auVar20._12_4_ = (int)((ulong)dVar52 >> 0x20);
  dVar136 = -dVar335 * dVar306 * dVar275;
  dVar302 = dStack_1a40 * -(dVar183 * dVar307) * dVar91 * dStack_19e0;
  dVar310 = dVar42 * dVar213 * dVar91 * dStack_19e0;
  dVar231 = dVar247 * dVar307 * dStack_1a40 * dVar91 * dVar275;
  dVar65 = dVar65 * dStack_19e0;
  local_e68 = dVar178 * dVar275;
  dStack_e60 = dVar48 * dStack_1860 * dVar44 * dVar91 * dVar299;
  dVar156 = dVar306 * dVar94 * dVar275;
  dStack_d10 = dVar79 * dVar249 * dStack_f60 * dVar299;
  dVar157 = dVar49 * dStack_1a40 * dVar91 * dVar275;
  dStack_c50 = dVar93 * dStack_1a40 * dVar79 * dVar299;
  dVar174 = -dVar183 * dVar268 * dVar44 * dVar91 * dVar299;
  dVar158 = -dVar51 * dVar275;
  dVar175 = dVar249 * dStack_f60 * dVar46 * dVar299;
  dVar271 = dVar271 * dVar275;
  dVar159 = dStack_7f0 * dVar42 * dVar91 * dVar275;
  dVar176 = -local_db8 * dVar126 * dVar299;
  dVar194 = dVar275 * dVar154;
  dVar214 = dVar299 * dVar173;
  dVar173 = dVar308 * dVar173;
  dVar195 = dVar267 * dVar307 * dVar349 * dVar91 * dVar275;
  dVar335 = dVar187 * dVar349 * dVar79;
  dStack_dd0 = dVar299 * dVar335;
  dVar263 = dVar126 * dVar169 * dVar299;
  local_dd8 = -dVar263;
  dStack_940 = -dVar335 * dVar308;
  local_948 = -local_798;
  dVar154 = dVar154 * dStack_19e0;
  dStack_1470 = auVar20._8_8_;
  dVar244 = dVar44 * dVar187;
  dVar97 = dVar42 * -dVar145 * dVar91 * dVar299;
  dVar213 = dVar188 * dVar46 * dVar308;
  dVar169 = dVar180 * dVar42 * dVar91;
  dVar117 = dVar91 * dVar249 * dVar145 * dVar299;
  dVar137 = dVar46 * dVar244 * dVar308;
  local_df8 = dVar308 * dVar79 * dVar244;
  dVar129 = dVar79 * dVar42 * dVar187 * dVar299;
  dVar322 = dVar126 * dVar349 * dStack_be0 * dVar299;
  dVar274 = -dVar350 * dVar46 * dVar47;
  dVar232 = dVar299 * dVar306 * dVar188;
  dVar245 = dVar47 * dVar91 * dVar212;
  dVar160 = dVar46 * dVar106 * dVar299;
  dVar303 = dVar91 * dVar212 * dVar308;
  dVar161 = dVar46 * dVar144 * dStack_19e0;
  dVar180 = dVar275 * dVar79 * dVar144;
  dStack_e30 = dVar141 * dStack_1a40 * dVar46 * dVar275;
  local_e38 = -dVar348;
  dVar233 = dVar275 * dVar169;
  dVar246 = dVar299 * dVar286 * dVar313 * dStack_1a40 * dVar46;
  dVar336 = local_848 * dVar46 * dVar299;
  dVar169 = dVar169 * dStack_19e0;
  dVar141 = local_818 * dVar46 * dStack_19e0;
  dStack_12a0 = auVar18._8_8_;
  dVar346 = dVar54 * dVar44 * dVar46;
  dVar183 = dVar275 * dVar346;
  dVar346 = dVar346 * dStack_19e0;
  dVar335 = -local_c38 * dVar80;
  dVar41 = dVar41 * dStack_19e0;
  local_eb8._8_4_ = SUB84(dVar41,0);
  local_eb8._0_8_ = dVar335;
  local_eb8._12_4_ = (int)((ulong)dVar41 >> 0x20);
  dVar207 = dStack_19e0 * dVar79 * dVar207 * dStack_1a40;
  dVar318 = dVar58 * dVar275;
  dVar234 = -(dVar349 * dStack_be0) * dVar91 * dVar308;
  dVar350 = dVar126 * dVar221 * dVar299;
  auVar21._8_4_ = SUB84(dVar100,0);
  auVar21._0_8_ = dVar350;
  auVar21._12_4_ = (int)((ulong)dVar100 >> 0x20);
  local_cc8 = dVar46 * dVar258 * dVar275;
  dVar212 = dVar46 * dVar104 * dVar44 * dStack_19e0;
  dStack_cc0 = -dVar116;
  dVar235 = -dVar281;
  dStack_10a0 = auVar21._8_8_;
  dVar62 = dVar62 * dVar47;
  dStack_1130 = auVar17._8_8_;
  dVar319 = dVar47 * dVar319;
  dVar323 = dStack_19e0 * dStack_1130;
  dVar162 = local_7c8 * dVar91 * dVar299;
  dVar163 = local_888 * dVar91 * dStack_19e0;
  dVar51 = dVar79 * dVar219 * dVar308;
  auVar22._8_4_ = SUB84(dVar51,0);
  auVar22._0_8_ = -dVar260 * dVar308;
  auVar22._12_4_ = (int)((ulong)dVar51 >> 0x20);
  dVar118 = dVar247 * dVar248 * dStack_1a40 * dVar91 * dStack_19e0;
  dVar312 = dVar79 * dVar42 * dVar95 * dVar299;
  dVar311 = -dVar312;
  dVar164 = dVar91 * dStack_860 * dStack_1a40 * dVar299;
  dVar187 = dStack_860 * dStack_1a40 * dVar297 * dVar299;
  dVar188 = dVar96 * dVar349 * dVar46;
  dVar343 = -dStack_c80 * dVar349 * dVar91 * dVar275;
  dVar347 = -dVar224;
  dStack_1440 = auVar22._8_8_;
  dVar291 = dStack_f60 * dVar349;
  local_f48 = -local_8b8 * dStack_19e0;
  dVar138 = dVar47 * dVar46 * dVar291;
  dVar236 = dVar291 * dVar79;
  local_f28 = dVar299 * dVar46 * dVar128 * dVar349;
  dVar177 = dVar299 * dVar209;
  dVar292 = dStack_db0 * dVar297 * dStack_19e0;
  dStack_1490 = auVar15._8_8_;
  dVar280 = dVar299 * dVar280;
  dStack_d40 = dVar299 * dStack_1490;
  dVar293 = -(dStack_1a40 * dStack_7f0) * dVar297 * dVar275;
  dVar283 = dVar95 * dVar249 * dVar79 * dVar299;
  dVar294 = dVar324 * dVar297 * dVar299;
  dVar41 = dVar46 * dVar291 * dVar299;
  dVar54 = local_868 * dVar91 * dVar299;
  auVar23._8_4_ = SUB84(dVar54,0);
  auVar23._0_8_ = dVar41;
  auVar23._12_4_ = (int)((ulong)dVar54 >> 0x20);
  dVar264 = dVar91 * local_788 * dVar47;
  local_f38 = local_ce8 * dVar44 * dVar79 * dVar299;
  dStack_d50 = -(dVar92 * dVar268) * dVar44 * dVar91 * dVar299;
  dVar196 = dVar91 * dStack_1690 * dVar313 * dVar44 * dVar299;
  dVar215 = dVar306 * dVar242 * dVar299;
  dStack_14a0 = auVar16._8_8_;
  dVar300 = dVar300 * dVar299;
  dStack_d20 = dStack_14a0 * dVar299;
  dVar219 = dVar93 * dVar349 * dVar46 * dVar299;
  dVar221 = dVar46 * -dVar95 * dVar269 * dVar299;
  local_ef8 = dVar315 * dVar46 * dVar299;
  dStack_ef0 = dVar341 * dVar79 * dVar299;
  dVar295 = dVar299 * local_788 * dVar297;
  local_bc8 = dVar79 * dVar179 * dStack_1a40 * dVar275;
  dStack_bc0 = dVar91 * dVar211 * dVar308;
  local_ea8 = -dVar186 * dVar275;
  dStack_ea0 = dVar236 * dVar308;
  dVar304 = -local_778 * dVar91 * dVar47;
  dVar284 = dVar297 * local_778 * dVar299;
  dVar237 = dVar91 * dStack_1a40 * dStack_7f0 * dVar275;
  dVar332 = dVar46 * dVar242 * dVar308;
  dStack_1900 = auVar8._8_8_;
  dVar242 = local_7f8 * dVar91 * dVar275;
  dVar165 = local_768 * dVar79 * dVar299;
  dVar315 = dVar79 * dVar106 * dVar47;
  dVar324 = dVar47 * local_838 * dVar46;
  dVar197 = -(local_838 * dVar46) * dVar299;
  dVar166 = -(dVar127 * dVar42) * dVar79 * dVar275;
  dVar341 = local_7e8 * dVar46 * dVar299;
  dVar119 = dStack_19e0 * dVar46 * dVar94;
  dVar95 = dVar140 * dVar249 * dVar79 * dVar275;
  dVar106 = -dVar104 * dVar349 * dVar79 * dStack_19e0;
  local_c98 = dVar46 * dVar258 * dVar275;
  dStack_c90 = dVar79 * dVar104 * dVar44 * dStack_19e0;
  dVar198 = dVar26 * dStack_1860 * dVar349 * dVar79 * dVar299;
  dVar199 = local_738 * dVar79 * dVar299;
  dVar265 = dVar46 * dVar107 * dVar299;
  dVar266 = -dVar265;
  dVar104 = dVar105 * dVar349 * dVar79 * dStack_19e0;
  dVar167 = -dVar105 * dStack_1a40 * dVar79 * dVar275;
  dVar72 = dVar72 * dVar79 * dStack_19e0;
  dStack_f40 = dVar103 * dVar269 * dVar91 * dVar299;
  dStack_1250 = auVar19._8_8_;
  local_d08 = dStack_1250 * dVar251;
  dStack_d00 = dStack_1250;
  dStack_f20 = dVar321 * dVar269 * dVar91 * dStack_19e0;
  local_d38 = dVar275 * dVar340;
  dStack_d30 = dStack_19e0 * dVar126 * dVar289;
  dVar340 = dVar340 * dVar80;
  dVar103 = dStack_7f0 * dVar269 * dVar91 * dVar275;
  dVar105 = dVar267 * dVar268 * dVar349 * dVar91 * dVar299;
  local_c18 = dVar105 * dVar251;
  dVar107 = dVar267 * dVar268 * dVar44 * dVar91 * dVar299;
  uStack_1870 = SUB84(dVar174,0);
  uStack_186c = (undefined4)((ulong)dVar174 >> 0x20);
  local_f18._8_4_ = uStack_1870;
  local_f18._0_8_ = dVar107;
  local_f18._12_4_ = uStack_186c;
  local_c28 = dVar107 * dVar250;
  local_be8 = local_be8 * dVar251;
  dVar128 = dVar342 * dVar306 * dVar299;
  dVar50 = dVar50 * dVar269 * dVar46 * dVar299;
  uStack_970._0_4_ = SUB84(dVar320,0);
  uStack_970._4_4_ = (undefined4)((ulong)dVar320 >> 0x20);
  auVar24._8_4_ = (undefined4)uStack_970;
  auVar24._0_8_ = dVar50;
  auVar24._12_4_ = uStack_970._4_4_;
  local_c88 = dVar50 * dVar251;
  dVar144 = dVar79 * dVar144 * dVar80;
  uStack_1580 = SUB84(dVar221,0);
  uStack_157c = (undefined4)((ulong)dVar221 >> 0x20);
  auVar25._8_4_ = uStack_1580;
  auVar25._0_8_ = dVar144;
  auVar25._12_4_ = uStack_157c;
  local_e78 = dVar144 * dVar251;
  local_b78 = local_b78 * dVar251;
  dVar94 = dVar46 * dVar94 * dVar80;
  local_ed8 = dVar94 * dVar251;
  local_d18 = dVar156 * dVar251;
  local_ec8 = -(dVar220 * dVar306) * dStack_19e0;
  dStack_fa0 = dVar79 * dVar73 * dStack_19e0;
  local_fa8 = local_ec8 * dVar250;
  dVar73 = dVar46 * dVar140 * dVar269 * dStack_19e0;
  local_cf8 = dVar73 * dVar251;
  dStack_c70 = -dStack_b70;
  dVar342 = -(dVar140 * dVar269) * dVar79 * dVar275;
  local_c78 = dVar342 * dVar251;
  local_f98 = local_ce8 * dVar349 * dVar79 * dVar299;
  local_b68 = -(dVar79 * dVar253) * dVar275;
  dStack_f90 = dVar142 * dStack_19e0;
  local_c08 = local_f98 * dVar251;
  dVar179 = local_ce8 * dStack_1a40 * dVar46 * dVar299;
  local_c68 = dVar179 * dVar251;
  local_d58 = local_f38 * dVar250;
  local_d48 = dVar280 * dVar251;
  local_d28 = dVar300 * dVar251;
  local_f68 = dStack_1690 * dStack_1860 * dVar44 * dVar91 * dVar299;
  local_c48 = local_f68 * dVar250;
  dVar186 = dVar49 * dVar349 * dVar91 * dStack_19e0;
  local_c58 = -(dVar48 * dStack_1860) * dVar349 * dVar91 * dVar299;
  dVar220 = dVar321 * dVar44 * dVar91;
  dVar289 = dStack_19e0 * dVar220;
  dVar220 = dVar220 * dVar80;
  local_d68 = local_f88 * dVar250;
  dStack_d60 = dVar220 * dVar270;
  local_f38 = local_f38 * dVar250;
  dStack_f30 = dStack_d50 * dVar270;
  dVar142 = -dVar142 * dVar80;
  local_b48 = dVar79 * dVar253 * dVar80 * dVar250;
  dStack_b40 = dVar142 * dVar270;
  local_b58 = -(dVar253 * dVar306) * dStack_19e0 * dVar250;
  dStack_b50 = dStack_d50 * dVar270;
  dVar48 = dVar48 * dVar298 * dVar44 * dVar91;
  dVar321 = -dVar178 * dStack_19e0;
  dStack_b30 = dVar139 * dStack_1a40 * dVar91 * dStack_19e0;
  local_b38 = dVar321 * dVar250;
  dVar139 = dVar79 * dVar244 * dVar299;
  dVar244 = dVar244 * dVar306 * dVar299;
  dStack_15a0 = auVar23._8_8_;
  dVar178 = -dVar258 * dVar79 * dVar275;
  local_c38 = local_c38 * dVar275;
  dStack_c30 = dVar79 * dVar208 * dVar307 * dStack_1a40 * dStack_19e0;
  dVar184 = dVar184 * dVar269 * dVar91 * dVar275;
  dStack_1130 = auVar24._8_8_;
  dStack_1430 = auVar25._8_8_;
  dVar258 = -dVar283;
  local_b88 = local_b88 * dVar47;
  dStack_b80 = -dVar210 * dVar80;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       dVar321 * dVar250 +
       local_e68 * dVar270 +
       dVar157 * dVar251 +
       -dVar186 * dVar251 +
       -local_f68 * dVar250 +
       dVar300 * dVar251 +
       dVar196 * dVar270 +
       dVar280 * dVar251 +
       local_f38 +
       dVar67 * dVar270 +
       -dVar179 * dVar251 +
       local_f98 * dVar251 +
       dVar342 * dVar251 +
       dVar73 * dVar251 +
       local_ec8 * dVar250 +
       local_998 * dVar270 +
       dVar80 * local_9b8 * dVar250 +
       -local_9b8 * dVar275 * dStack_1900 +
       -local_6e8 * dVar80 * dVar270 +
       dStack_19e0 * local_6e8 * dStack_1900 +
       dVar156 * dVar251 +
       ((local_688 * dVar251 +
        dVar144 * dVar251 +
        dVar50 * dVar251 +
        -dVar128 * dVar250 +
        dStack_1900 * dVar71 +
        dVar64 * dVar251 +
        local_6d8 * dVar251 +
        dVar244 * dVar270 +
        ((dVar232 * dVar251 +
         dVar107 * dVar250 +
         dVar105 * dVar251 +
         -dVar103 * dVar251 +
         dVar340 * dVar250 +
         -local_d38 * dStack_1900 +
         dVar331 * dVar251 +
         local_d88 * dVar251 +
         dVar299 * local_ee8 * dStack_1900 +
         local_d98 * dVar270 +
         local_988 * dVar251 +
         dStack_f20 * dVar251 +
         ((dVar289 * dStack_1900 +
          dStack_1250 * dVar251 +
          dStack_f40 * dVar251 +
          dStack_bf0 * dStack_1900 +
          dVar82 * dVar250 +
          dStack_740 * dVar270 +
          dVar167 * dVar251 +
          dVar104 * dVar251 +
          dVar199 * dVar250 +
          dVar198 * dVar251 +
          dStack_9a0 * dVar270 +
          dStack_750 * dVar251 +
          -dStack_c90 * dVar250 +
          dVar212 * dVar270 +
          dStack_9f0 * dVar251 +
          dVar106 * dVar251 +
          dVar95 * dVar270 +
          -dVar81 * dVar270 +
          dVar86 * local_e08 +
          ((dVar341 * dVar270 +
           dStack_bd0 * dVar250 +
           dVar85 * dVar270 +
           dVar324 * dVar251 +
           dVar197 * local_e08 +
           dVar315 * dVar251 +
           dVar165 * dVar270 +
           local_e08 * dStack_ba0 +
           dVar61 * dVar250 +
           dStack_8d0 * dVar251 +
           dVar242 * dVar270 +
           dVar69 * dVar250 +
           -dVar148 * dVar270 +
           dVar293 * dVar251 +
           dVar237 * local_e08 +
           dVar292 * dVar251 +
           dVar250 * dVar284 +
           dVar304 * dVar250 +
           dVar295 * dVar251 +
           ((dVar270 * dStack_15a0 +
            dVar294 * dVar270 +
            -dVar187 * dVar251 +
            dVar164 * local_e08 +
            dVar323 * dVar270 +
            dVar118 * dVar251 +
            dVar163 * dVar270 +
            dVar83 * local_e08 +
            ((dStack_8b0 * dVar47 * dVar270 +
             dVar62 * dVar251 +
             dStack_900 * local_e08 +
             dVar346 * dVar250 +
             -dVar183 * dVar270 +
             dStack_12a0 * dVar251 +
             dVar141 * dVar251 +
             dVar130 * dVar250 +
             dVar290 * dVar251 +
             dVar336 * dVar270 +
             ((dStack_920 * dVar250 +
              dVar134 * dVar270 +
              dStack_e30 * dVar251 +
              dVar135 * dVar251 +
              dVar90 * dVar250 +
              dStack_1060 * dVar250 +
              dVar180 * dStack_e00 +
              -dVar161 * dStack_e00 +
              dVar133 * dVar250 +
              dVar160 * dStack_e00 +
              dVar129 * dVar250 +
              -local_df8 * dVar250 +
              dVar137 * dVar270 +
              dVar213 * dVar251 +
              dStack_940 * dVar251 +
              dStack_dd0 * dStack_e00 +
              dVar171 * dVar250 +
              -dVar195 * dVar251 +
              dVar159 * dVar250 +
              dStack_1470 * dStack_e00 +
              dVar272 * dVar250 +
              local_ee8 * dVar308 * dVar250 +
              -dVar173 * dVar251 +
              dVar214 * dStack_e00 +
              dVar330 * dVar270 +
              dVar231 * dVar251 +
              dVar310 * dVar250 +
              dStack_930 * dVar250 +
              ((dVar282 * dVar251 +
               dVar309 * dVar251 +
               dVar172 * dStack_e00 +
               -dVar112 * dVar250 +
               dVar243 * dVar250 +
               dVar228 * dVar251 +
               ((dVar227 * dVar270 + dVar339 * dVar270 + dVar170 * dVar251 + -dVar185 * dVar251) -
               dVar89 * dStack_e00)) - dVar230 * dVar270)) - dVar246 * dVar251)) - dVar162 * dVar270
            )) - dVar264 * dVar251)) - dVar119 * local_e08)) - dStack_d60)) - dVar139 * dStack_1900)
        ) - dVar94 * dVar251);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       dStack_b30 * dVar251 +
       dStack_e60 * dVar270 +
       dStack_c50 * dVar251 +
       dStack_f00 * dVar251 +
       dStack_9e0 * dVar251 +
       dStack_d20 * dVar251 +
       dVar215 * dVar270 +
       dStack_d40 * dStack_1900 +
       dStack_f30 +
       dVar87 * dVar251 +
       dVar142 * dVar270 +
       dStack_f90 * dStack_1900 +
       dStack_950 * dVar251 +
       dVar287 * dVar250 +
       dStack_fa0 * dVar251 +
       dStack_8c0 * dVar270 +
       dVar219 * dVar251 +
       -dVar207 * dVar251 +
       dVar136 * dVar251 +
       dStack_f50 * dVar251 +
       dStack_d10 * dVar270 +
       ((dStack_680 * local_e08 +
        dStack_1430 * dVar251 +
        dStack_1130 * dVar250 +
        dStack_e80 * dStack_1900 +
        dVar270 * dVar88 +
        (double)local_8e8._8_8_ * dVar270 +
        dStack_6d0 * dVar251 +
        -dStack_f80 * local_e08 +
        ((dVar245 * dVar270 +
         (double)local_f18._8_8_ * dVar250 +
         dVar184 * dVar251 +
         dVar335 * dVar250 +
         local_c38 * dStack_1900 +
         local_968 * dVar250 +
         dVar158 * dVar270 +
         dStack_d80 * dVar251 +
         dVar275 * dStack_ee0 * dVar251 +
         dStack_d90 * dVar251 +
         dStack_980 * dVar250 +
         local_f28 * dVar251 +
         ((-local_ef8 * dVar270 +
          dVar43 * dVar251 +
          local_f48 * dVar250 +
          local_bf8 * dVar270 +
          dVar59 * dVar251 +
          local_748 * dVar251 +
          -dVar72 * dVar251 +
          -dVar218 * dVar250 +
          dVar266 * dVar270 +
          dVar68 * dVar251 +
          local_9a8 * dVar270 +
          local_758 * dVar251 +
          dVar178 * dVar250 +
          local_cc8 * dVar270 +
          local_9f8 * dVar251 +
          -local_9d8 * dVar251 +
          -(local_828 * dStack_19e0) * dVar251 +
          dVar333 * dVar250 +
          dVar63 * dVar270 +
          ((-dVar314 * dVar251 +
           local_bd8 * dVar251 +
           dVar60 * dVar250 +
           dVar131 * dVar250 +
           dVar166 * dVar270 +
           local_f78 * dVar270 +
           dVar271 * dStack_e00 +
           dStack_e00 * local_ba8 +
           dStack_720 * local_e08 +
           local_8d8 * local_e08 +
           -dVar175 * dVar250 +
           dVar70 * dVar250 +
           dVar56 * dVar270 +
           dStack_1490 * dVar308 * dVar250 +
           dVar332 * dVar270 +
           dVar209 * dVar308 * dVar251 +
           dStack_e00 * -dVar177 +
           -dStack_ea0 * dVar251 +
           dVar299 * dVar236 * dStack_e00 +
           ((local_e08 * dVar41 +
            dVar283 * dVar250 +
            local_da8 * dVar299 * dVar270 +
            dVar311 * dVar270 +
            dVar319 * dVar250 +
            dVar274 * dVar270 +
            -dVar51 * dVar251 +
            dVar224 * dStack_e00 +
            ((dVar299 * dVar260 * local_e08 +
             dVar273 * dVar47 * dVar251 +
             local_908 * local_e08 +
             -dVar132 * dVar250 +
             dVar343 * dVar251 +
             dVar53 * dVar250 +
             dVar334 * dVar270 +
             dVar100 * dVar251 +
             dVar281 * dVar250 +
             -dVar169 * dVar250 +
             ((local_928 * dVar250 +
              dVar115 * dVar270 +
              local_e38 * dVar251 +
              dVar116 * dStack_e00 +
              dVar277 * dVar251 +
              dVar252 * dVar251 +
              -(dVar58 * dStack_19e0) * dStack_e00 +
              -dVar318 * local_e08 +
              dVar113 * dVar250 +
              -dVar303 * dVar250 +
              dVar322 * dVar251 +
              dVar234 * dVar251 +
              dVar117 * dVar250 +
              dVar97 * dVar270 +
              local_948 * dVar250 +
              local_dd8 * dVar270 +
              dVar47 * dVar66 * dVar250 +
              dVar147 * dVar270 +
              dVar176 * dVar251 +
              dVar217 * dStack_e00 +
              dVar259 * dVar251 +
              dVar108 * local_e08 +
              dVar154 * dVar250 +
              dVar194 * dVar270 +
              dVar327 * dVar251 +
              -dVar65 * dVar270 +
              dVar302 * dVar251 +
              local_938 * dVar250 +
              ((dVar345 * dVar270 +
               dVar301 * dVar250 +
               dVar153 * dVar270 +
               dVar114 * dVar251 +
               dVar229 * dVar251 +
               -dStack_f70 * dStack_e00 +
               ((-dVar45 * dVar251 +
                dStack_de0 * local_e08 +
                dVar143 * dVar250 +
                ((((((((((((((dVar255 - dStack_790 * dVar250) - dVar256) + dVar257) - dVar191) +
                          dVar110 + dVar111) - dVar326) + dVar325) - dVar344) - local_cd8 * dVar250)
                     + dVar262 + dVar102 + dVar149) - dVar57) + dVar99 + dVar150 + dVar225 + dVar193
                   + dVar151 + dVar152 + local_d78 * dVar250) - local_e28 * dVar270) - dVar317) +
                dVar192) - dVar210 * dVar275 * local_e08)) - dVar84 * dVar270)) - dVar233 * dVar270)
             ) - dVar47 * dVar260 * dVar251)) - dVar138 * dVar251)) - local_bc8 * dVar251)) -
         local_d68)) - dStack_b90 * dVar270)) - local_b88 * dVar251);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       -dVar48 * dStack_19e0 * dVar250 +
       dVar275 * dVar48 * dVar270 +
       local_c58 * dVar251 +
       local_f08 * dVar251 +
       local_9e8 * dVar250 +
       -(dVar93 * dVar44) * dVar46 * dVar299 * dVar270 +
       -(dVar127 * dVar269) * dVar79 * dVar275 * dVar251 +
       dVar46 * dVar127 * dVar269 * dStack_19e0 * dVar251 +
       local_b58 +
       dVar275 * dVar253 * dVar306 * dVar270 +
       local_b48 +
       local_b68 * dStack_1900 +
       local_958 * dVar270 +
       dStack_1900 * dStack_19e0 * dVar46 * dVar253 +
       -dVar291 * dVar306 * dVar299 * dVar251 +
       local_cb8 * dVar251 +
       dVar92 * dVar268 * dVar349 * dVar91 * dVar299 * dVar251 +
       dVar80 * dVar58 * dVar251 +
       -dVar145 * dVar269 * dVar91 * dVar299 * dVar251 +
       local_f58 * dStack_1900 +
       dStack_9c0 * dVar91 * dVar299 * dVar251 +
       dStack_b80 * dVar251 +
       local_678 * dVar251 +
       dVar226 * dVar299 * dStack_1900 +
       local_978 * dVar251 +
       local_e88 * dVar251 +
       -dStack_ee0 * dStack_19e0 * dVar251 +
       dStack_8c0 * dVar250 +
       local_bb8 * dVar270 +
       local_f88 * dVar270 +
       local_b98 * dVar251 +
       local_e98 * dVar79 * dVar299 * dVar270 +
       -dVar208 * dVar248 * dStack_1a40 * dVar79 * dVar275 * dVar251 +
       -dVar146 * dStack_19e0 * dVar251 +
       (double)local_eb8._8_8_ * dVar251 +
       dStack_c30 * dVar251 +
       dStack_960 * dVar250 +
       dVar175 * dVar270 +
       dStack_ca0 * dVar270 +
       -dVar155 * dVar308 * dVar251 +
       dVar299 * dVar155 * dStack_e00 +
       dStack_690 * dVar251 +
       dVar177 * local_e08 +
       dVar236 * dVar47 * dVar251 +
       dStack_ef0 * local_e08 +
       dVar258 * dVar270 +
       dVar96 * dStack_1a40 * dVar79 * dVar47 * dVar251 +
       dVar347 * local_e08 +
       dVar88 * dVar250 +
       dStack_6f0 * dVar270 +
       dStack_1030 * dVar91 * dStack_19e0 * dVar270 +
       -dVar288 * dVar249 * dVar91 * dStack_19e0 * dVar250 +
       dVar235 * dVar270 +
       dVar42 * dVar288 * dVar91 * dStack_19e0 * dVar270 +
       dStack_6a0 * dVar251 +
       dStack_710 * dVar251 +
       dStack_e00 * -(dVar288 * dStack_1a40) * dVar91 * dStack_19e0 +
       dStack_cc0 * local_e08 +
       dStack_700 * dVar251 +
       dStack_9d0 * local_e08 +
       -dStack_b90 * dVar250 +
       -dVar211 * dVar126 * dVar299 * dVar270 +
       dVar245 * dVar250 +
       dStack_bc0 * dVar270 +
       local_798 * dVar270 +
       dStack_6b0 * dVar270 +
       -dVar154 * dVar270 +
       local_e18 * dVar270 +
       dVar279 * dVar297 * dStack_19e0 * dVar251 +
       dStack_f70 * local_e08 +
       dVar270 * dVar297 * dVar55 * dVar299 +
       -local_d78 * dVar270 +
       dVar251 * local_728 +
       dStack_8a0 +
       dVar222 * dVar275 * dVar251 +
       -dVar98 * dVar298 * dVar349 * dVar79 * dVar275 * dVar251 +
       dStack_fb0 * dVar251 +
       dVar266 * dVar250 +
       dVar79 * local_7a8 * dVar299 * dVar250 +
       local_cd8 * dVar270 +
       dVar46 * local_9c8 * dVar275 * dVar251 +
       local_ea8 * dVar251 +
       dVar101 * dVar275 * dVar251 +
       dStack_19e0 * dVar46 * dVar208 * dVar307 * dVar349 * dVar251 +
       dVar56 * dVar250 +
       local_6c8 * dVar308 * dVar251 +
       dVar41 * dStack_e00 +
       dVar46 * dVar249 * dVar96 * dVar299 * dVar250 +
       dVar311 * dVar250 +
       -dVar96 * dVar42 * dVar46 * dVar299 * dVar270 +
       -dVar260 * dVar308 * dVar251 +
       local_898 * dVar299 * dStack_e00 +
       dVar308 * dVar273 * dVar251 +
       ((dVar47 * dVar188 * dVar251 +
        -dVar188 * dVar299 * local_e08 +
        dVar334 * dVar250 +
        -dVar233 * dVar250 +
        dVar126 * dVar288 * dVar349 * dVar275 * dVar251 +
        ((dVar350 * dVar250 +
         dVar147 * dVar250 +
         dVar181 * dVar248 * dVar44 * dVar91 * dVar275 * dVar250 +
         local_7d8 * dVar91 * dStack_19e0 * dVar250 +
         local_918 * dVar270 +
         -dVar182 * dVar249 * dVar91 * dVar275 * dVar250 +
         dVar345 * dVar250 +
         dVar182 * dVar42 * dVar91 * dVar275 * dVar270 +
         dVar338 * dVar126 * dVar275 * dVar251 +
         dVar91 * dVar279 * dVar275 * dStack_e00 +
         -(dVar182 * dVar349) * dVar297 * dVar275 * dVar251 +
         -local_7b8 * dStack_19e0 * dVar251 +
         dStack_de0 * dStack_e00 +
         dVar91 * dVar182 * dVar349 * dVar275 * local_e08 +
         -local_e28 * dVar250 +
         dVar55 * dVar91 * dVar308 * dVar250 +
         dVar297 * local_808 * dVar299 * dVar250 +
         -dVar254 * dVar270 + dStack_790 * dVar270 + -local_808 * dVar91 * dVar47 * dVar250) -
        dVar318 * dStack_e00)) - dVar223 * dStack_e00);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       dStack_b30 * dVar251 +
       dStack_e60 * dVar270 +
       dStack_c50 * dVar251 +
       dStack_f00 * dVar251 +
       dStack_9e0 * dVar251 +
       dStack_d20 * dVar251 +
       dVar215 * dVar270 +
       dStack_d40 * dStack_1900 +
       dStack_b50 +
       dVar87 * dVar251 +
       dStack_b40 +
       dStack_f90 * dStack_1900 +
       dStack_950 * dVar251 +
       dVar250 * dVar287 +
       -dStack_fa0 * dVar251 +
       dStack_cb0 * dVar270 +
       dVar219 * dVar251 +
       dVar207 * dVar251 +
       dVar136 * dVar251 +
       dStack_f50 * dVar251 +
       -dStack_d10 * dVar270 +
       local_b88 * dVar251 +
       dStack_670 * local_e08 +
       dVar221 * dVar251 +
       dVar320 * dVar250 +
       dStack_e80 * dStack_1900 +
       -dVar88 * dVar270 +
       dVar316 * dVar270 +
       dStack_bb0 * dVar251 +
       dStack_f80 * local_e08 +
       dStack_b90 * dVar270 +
       -dVar245 * dVar270 +
       dVar174 * dVar250 +
       dVar184 * dVar251 +
       dVar335 * dVar250 +
       local_c38 * dStack_1900 +
       local_968 * dVar250 +
       dVar158 * dVar270 +
       local_ca8 * dVar251 +
       -(dVar275 * dStack_ee0) * dVar251 +
       -dStack_d90 * dVar251 +
       local_698 * dVar250 +
       local_f28 * dVar251 +
       local_f88 * dVar250 +
       local_ef8 * dVar270 +
       dVar43 * dVar251 +
       local_f48 * dVar250 +
       local_bf8 * dVar270 +
       -dVar59 * dVar251 +
       local_6f8 * dVar251 +
       dVar72 * dVar251 +
       dVar218 * dVar250 +
       dVar265 * dVar270 +
       dVar68 * dVar251 +
       local_6a8 * dVar270 +
       local_758 * dVar251 +
       dVar250 * dVar178 +
       local_cc8 * dVar270 +
       local_708 * dVar251 +
       local_9d8 * dVar251 +
       local_828 * dStack_19e0 * dVar251 +
       dVar333 * dVar250 +
       dVar63 * dVar270 +
       local_bc8 * dVar251 +
       dVar314 * dVar251 +
       local_6b8 * dVar251 +
       dVar60 * dVar250 +
       dVar131 * dVar250 +
       dVar166 * dVar270 +
       local_f78 * dVar270 +
       dStack_e00 * dVar271 +
       local_ba8 * dStack_e00 +
       local_e08 * dStack_720 +
       local_8a8 +
       dVar175 * dVar250 +
       -dVar70 * dVar250 +
       local_fb8 * dVar270 +
       dStack_1490 * dVar308 * dVar250 +
       dVar332 * dVar270 +
       -(dVar209 * dVar308) * dVar251 +
       dVar177 * dStack_e00 +
       dStack_ea0 * dVar251 +
       -(dVar299 * dVar236) * dStack_e00 +
       dVar138 * dVar251 +
       -dVar41 * local_e08 +
       dVar258 * dVar250 +
       -(local_da8 * dVar299) * dVar270 +
       dVar312 * dVar270 +
       dVar319 * dVar250 +
       dVar274 * dVar270 +
       dStack_1440 * dVar251 +
       dVar347 * dStack_e00 +
       dVar47 * dVar260 * dVar251 +
       ((-(dVar273 * dVar47) * dVar251 +
        dVar223 * local_e08 +
        dVar132 * dVar250 +
        dVar343 * dVar251 +
        -dVar53 * dVar250 +
        ((dStack_10a0 * dVar251 +
         dVar235 * dVar250 +
         dVar169 * dVar250 +
         dVar233 * dVar270 +
         local_928 * dVar250 +
         dVar115 * dVar270 +
         dVar348 * dVar251 +
         dStack_cc0 * dStack_e00 +
         -dVar277 * dVar251 +
         -dVar252 * dVar251 +
         dVar58 * dStack_19e0 * dStack_e00 +
         dVar318 * local_e08 +
         local_de8 * dVar250 +
         dVar303 * dVar250 +
         dVar322 * dVar251 +
         dVar234 * dVar251 +
         dVar117 * dVar250 +
         dVar97 * dVar270 +
         local_798 * dVar250 +
         dVar263 * dVar270 +
         (((dVar176 * dVar251 +
           dVar217 * dStack_e00 +
           dVar259 * dVar251 +
           dVar108 * local_e08 +
           (((dVar327 * dVar251 +
             dVar65 * dVar270 +
             dVar302 * dVar251 +
             local_e18 * dVar250 +
             dVar84 * dVar270 +
             ((dVar301 * dVar250 +
              dVar153 * dVar270 +
              (((dStack_f70 * dStack_e00 +
                dVar210 * dVar275 * local_e08 +
                dVar45 * dVar251 +
                ((dVar143 * dVar250 +
                 (((((((local_cd8 * dVar250 +
                       dVar344 + (((((dVar191 +
                                     (((dStack_790 * dVar250 - dVar255) + dVar256) - dVar257)) -
                                    dVar110) - dVar111) + dVar326) - dVar325)) - dVar262) + dVar102
                      + dVar149 + dVar57) - dVar99) + dVar150 + dVar225 + dVar193 + dVar151) -
                  dVar152) - local_d78 * dVar250) + local_e28 * dVar270 + dVar317 + dVar192) -
                dStack_de0 * local_e08)) - dVar229 * dVar251) - dVar114 * dVar251)) -
             dVar345 * dVar270)) - dVar194 * dVar270) - dVar154 * dVar250)) - dVar147 * dVar270) -
         dVar47 * dVar66 * dVar250)) - dVar334 * dVar270)) - dVar299 * dVar260 * local_e08);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       local_b38 +
       local_e68 * dVar270 +
       ((dVar186 * dVar251 +
        local_c48 +
        local_d28 +
        ((local_d48 +
         local_d58 +
         dVar67 * dVar270 +
         local_c68 +
         ((local_c78 +
          local_cf8 +
          local_fa8 +
          local_998 * dVar270 +
          dVar80 * local_9b8 * dVar250 +
          -local_9b8 * dVar275 * dStack_1900 +
          -local_6e8 * dVar80 * dVar270 +
          dStack_19e0 * local_6e8 * dStack_1900 +
          ((local_ed8 +
           local_b78 +
           (((dVar128 * dVar250 +
             ((dVar64 * dVar251 +
              local_be8 +
              ((dVar139 * dStack_1900 +
               dVar232 * dVar251 +
               ((local_c18 +
                dVar103 * dVar251 +
                ((local_d38 * dStack_1900 +
                 dVar331 * dVar251 +
                 local_d88 * dVar251 +
                 dVar299 * local_ee8 * dStack_1900 +
                 dVar278 * dVar270 +
                 local_988 * dVar251 +
                 ((dVar220 * dVar270 +
                  ((local_d08 +
                   dStack_f40 * dVar251 +
                   dStack_bf0 * dStack_1900 +
                   ((dVar329 * dVar270 +
                    dVar167 * dVar251 +
                    dVar104 * dVar251 +
                    dVar199 * dVar250 +
                    ((dStack_9a0 * dVar270 +
                     dVar189 * dVar251 +
                     dStack_c90 * dVar250 +
                     ((dStack_9f0 * dVar251 +
                      dVar106 * dVar251 +
                      ((dVar81 * dVar270 +
                       ((dVar119 * local_e08 +
                        dVar341 * dVar270 +
                        local_878 * dVar250 +
                        ((dVar324 * dVar251 +
                         dVar197 * local_e08 +
                         dVar315 * dVar251 +
                         dVar165 * dVar270 +
                         dStack_ba0 * local_e08 +
                         dVar61 * dVar250 +
                         dVar190 * dVar251 +
                         dVar242 * dVar270 +
                         ((dVar148 * dVar270 +
                          dVar293 * dVar251 +
                          dVar237 * local_e08 +
                          dVar292 * dVar251 +
                          dVar284 * dVar250 +
                          dVar304 * dVar250 +
                          ((dVar264 * dVar251 +
                           ((dVar294 * dVar270 +
                            dVar187 * dVar251 +
                            ((dVar323 * dVar270 +
                             ((dVar163 * dVar270 +
                              dVar83 * local_e08 +
                              dVar162 * dVar270 +
                              dStack_8b0 * dVar47 * dVar270 +
                              ((dVar261 * local_e08 +
                               ((dVar183 * dVar270 +
                                dStack_12a0 * dVar251 +
                                dVar141 * dVar251 +
                                dVar130 * dVar250 +
                                ((dVar336 * dVar270 +
                                 dVar246 * dVar251 +
                                 dVar216 * dVar250 +
                                 ((dStack_e30 * dVar251 +
                                  dVar135 * dVar251 +
                                  ((dVar109 * dVar250 +
                                   ((dVar161 * dStack_e00 +
                                    dVar133 * dVar250 +
                                    dVar160 * dStack_e00 +
                                    dVar129 * dVar250 +
                                    local_df8 * dVar250 +
                                    ((dVar213 * dVar251 +
                                     dStack_940 * dVar251 +
                                     dStack_dd0 * dStack_e00 +
                                     dVar171 * dVar250 +
                                     dVar195 * dVar251 +
                                     dVar159 * dVar250 +
                                     dVar52 * dStack_e00 +
                                     ((local_ee8 * dVar308 * dVar250 +
                                      dVar173 * dVar251 +
                                      ((dVar330 * dVar270 +
                                       ((dVar310 * dVar250 +
                                        ((dVar230 * dVar270 +
                                         dVar282 * dVar251 +
                                         dVar309 * dVar251 +
                                         dVar172 * dStack_e00 +
                                         dVar112 * dVar250 +
                                         dVar243 * dVar250 +
                                         ((dVar89 * dStack_e00 +
                                          dVar227 * dVar270 +
                                          dVar339 * dVar270 +
                                          (dVar185 * dVar251 - dVar170 * dVar251)) -
                                         dVar228 * dVar251)) - dStack_930 * dVar250)) -
                                       dVar231 * dVar251)) - dVar214 * dStack_e00)) -
                                     dVar272 * dVar250)) - dVar137 * dVar270)) -
                                   dVar180 * dStack_e00)) - dVar90 * dVar250)) - dVar134 * dVar270))
                                - dVar290 * dVar251)) - dVar346 * dVar250)) - dVar62 * dVar251)) -
                             dVar118 * dVar251)) - dVar164 * local_e08)) - dVar54 * dVar270)) -
                          dVar295 * dVar251)) - dVar69 * dVar250)) - dVar85 * dVar270)) -
                       dVar86 * local_e08)) - dVar95 * dVar270)) - dVar212 * dVar270)) -
                    dVar198 * dVar251)) - dVar82 * dVar250)) - dVar289 * dStack_1900)) -
                 dStack_f20 * dVar251)) - dVar340 * dVar250)) - local_c28)) - dVar244 * dVar270)) -
             dVar71 * dStack_1900)) - local_c88) - local_e78)) - local_d18)) - local_c08)) -
        dVar196 * dVar270)) - dVar157 * dVar251);
  dStack_ed0 = dVar79;
  dStack_ec0 = dStack_fa0;
  dStack_e90 = dVar286;
  dStack_e70 = dVar79;
  local_e48 = dStack_f70;
  dStack_e40 = dStack_f70;
  dStack_e20 = dVar126;
  dStack_e10 = local_e18;
  dStack_df0 = dVar308;
  local_dc8 = dVar308;
  dStack_dc0 = dVar275;
  dStack_d70 = dVar80;
  dStack_cf0 = dVar79;
  dStack_ce0 = dVar286;
  dStack_c60 = dVar286;
  dStack_c40 = dStack_f60;
  dStack_c20 = dVar267;
  dStack_c10 = dVar267;
  dStack_c00 = dVar286;
  dStack_b60 = dStack_f90;
  dStack_9b0 = dVar79;
  uStack_970 = dVar320;
  dStack_910 = local_928;
  local_8c8 = local_998;
  dStack_890 = dVar79;
  dStack_870 = dVar79;
  dStack_830 = dStack_c80;
  dStack_820 = dVar79;
  dStack_810 = dVar286;
  dStack_800 = dVar267;
  dStack_7c0 = dVar267;
  dStack_7b0 = dVar126;
  dStack_7a0 = dVar286;
  dStack_780 = dVar267;
  dStack_770 = dVar267;
  dStack_760 = dStack_be0;
  local_718 = local_758;
  dStack_6e0 = dVar79;
  dStack_6c0 = dVar79;
  o4_roots<double>(&local_fd0,&local_168);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar38 = (int)((ulong)((long)local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  if (iVar38 != 0) {
    dVar44 = dVar46 * local_ce8;
    dVar349 = local_ce8 * dVar79;
    iVar37 = 0;
    do {
      dVar169 = local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      auVar285._0_8_ = 1.0 - dVar169 * dVar169;
      auVar125._0_8_ = dVar169 * dVar169 + 1.0;
      auVar285._8_8_ = dVar169 + dVar169;
      auVar125._8_8_ = auVar125._0_8_;
      auVar120 = divpd(auVar285,auVar125);
      local_ad0 = auVar120._0_8_;
      dVar344 = dVar276 * (double)local_ad0;
      local_ad8 = auVar120._8_8_;
      dVar319 = dVar298 * (double)local_ad0 * -dVar247;
      dVar51 = dVar126 * dVar319;
      dVar218 = dVar313 * dVar344;
      dVar54 = dVar286 * -(double)local_ad0 * dVar298 * dVar46;
      dVar192 = dVar298 * dVar267 * (double)local_ad0;
      dVar57 = -dVar192 * dVar297;
      dVar48 = dStack_1860 * dVar344;
      dVar42 = -(double)local_ad0 * dVar26 * dVar298 * dVar79;
      dVar319 = dVar319 * dVar91;
      dVar217 = dVar298 * dVar247 * local_ad8;
      dVar53 = -dVar217 * dVar297;
      dVar216 = dVar298 * dVar267 * local_ad8;
      dVar50 = dVar126 * dVar216;
      dVar68 = dVar276 * local_ad8;
      dVar316 = dVar313 * dVar68;
      dVar45 = dStack_1860 * -dVar68;
      dVar69 = -dVar68 * dVar248;
      local_288._0_8_ = -local_ad8;
      dVar52 = dVar286 * (double)local_288._0_8_ * dVar298 * dVar79;
      dVar55 = dVar26 * local_ad8 * dVar298 * dVar46;
      dVar216 = dVar216 * dVar91;
      dVar280 = local_ad8 * (double)local_ad0;
      dVar325 = (double)local_ad0 * (double)local_ad0;
      dVar72 = dVar247 * dVar325;
      dVar58 = dVar91 * dStack_1860 * dVar72;
      dVar335 = dVar267 * dVar325;
      dVar62 = local_ad8 * local_ad8;
      dVar73 = dVar247 * dVar62;
      dVar81 = dVar267 * dVar62;
      dVar56 = dVar91 * dVar313 * dVar81;
      dVar169 = dVar247 * dVar280;
      dVar59 = dVar313 * dVar169;
      dVar102 = dStack_1860 * dVar169;
      dVar70 = -dVar169 * dVar307 * dVar91;
      dVar169 = dVar248 * dVar169 * dVar91;
      dVar300 = dVar267 * dVar280;
      dVar64 = dVar313 * dVar300;
      dVar43 = dVar307 * dVar300 * dVar91;
      dVar65 = dVar313 * dVar286 * dVar280;
      dVar63 = dVar286 * dVar280 * dStack_1860;
      dVar66 = dVar313 * dVar280 * dVar26;
      dVar60 = dStack_1860 * dVar300;
      dVar71 = dVar300 * dVar248 * dVar91;
      dVar280 = -(dVar280 * dVar26) * dStack_1860;
      dVar192 = dVar192 * dVar91;
      dVar217 = dVar217 * dVar91;
      dVar300 = ((((dVar218 * dVar79 * dVar299 +
                   dVar192 * dVar275 +
                   dVar319 * dStack_19e0 +
                   (dVar140 * dVar46 * dStack_19e0 - dVar275 * dVar79 * dVar140)) -
                  dVar46 * dVar48 * dVar299) + dVar217 * dVar275) - dVar46 * dVar316 * dVar299) +
                dVar216 * dStack_19e0 + dVar45 * dVar79 * dVar299 + dVar58 * dVar299;
      dVar67 = -dVar335 * dVar313 * dVar91;
      dVar350 = dStack_1860 * dVar73 * dVar91;
      dVar61 = dVar350 * dVar299;
      dVar41 = dVar56 * dVar299;
      local_ac0 = -(dVar79 * dVar280 * dVar299 +
                   dVar71 * dStack_19e0 +
                   ((dVar91 * dVar60 * dVar47 +
                    (((dVar79 * dVar65 * dVar299 +
                      dVar43 * dVar275 +
                      ((dVar91 * dVar64 * dVar308 +
                       dVar169 * dVar275 +
                       dVar70 * dStack_19e0 +
                       ((dVar91 * dVar102 * dVar308 +
                        dVar297 * dVar59 * dVar299 +
                        -dVar59 * dVar91 * dVar47 +
                        dStack_1860 * dVar62 * dVar26 * dVar46 * dVar299 +
                        (((dVar307 * dVar81 * dVar91 * dStack_19e0 +
                          dStack_1860 * dVar81 * dVar126 * dVar299 +
                          ((dVar56 * dVar47 +
                           ((dVar313 * dVar325 * dVar26 * dVar79 * dVar299 +
                            dVar297 * dVar313 * dVar335 * dVar299 +
                            (((dVar313 * dVar286 * dVar325 * dVar46 * dVar299 +
                              ((dVar313 * dVar72 * dVar126 * dVar299 +
                               (((dVar306 * dVar45 * dVar299 +
                                 dVar267 * local_ad8 * dVar268 * dVar91 * dVar299 +
                                 dVar216 * dVar80 +
                                 dVar55 * dVar275 +
                                 dVar52 * dVar275 +
                                 dVar46 * dVar69 * dVar275 +
                                 dVar46 * dVar307 * dVar68 * dStack_19e0 +
                                 dVar46 * dVar45 * dVar308 +
                                 dVar46 * dVar316 * dVar47 +
                                 dVar50 * dVar275 +
                                 dVar53 * dVar275 +
                                 dVar313 * dStack_1690 * (double)local_ad0 * dVar91 * dVar299 +
                                 dVar306 * dVar218 * dVar299 +
                                 (double)local_ad0 * -dVar247 * dVar268 * dVar91 * dVar299 +
                                 dVar319 * dVar80 +
                                 dVar42 * dVar275 +
                                 dVar46 * dVar344 * dVar248 * dStack_19e0 +
                                 dVar46 * dVar48 * dVar47 +
                                 dVar57 * dVar275 +
                                 dVar54 * dVar275 +
                                 dVar46 * dVar307 * dVar344 * dVar275 +
                                 dVar46 * dVar218 * dVar308 +
                                 dVar51 * dVar275 +
                                 -dVar49 * dVar91 * dVar275 +
                                 dVar44 * dVar299 +
                                 dVar140 * dVar46 * dVar80 + -dVar140 * dVar306 * dVar275) -
                                dStack_1860 * dStack_1690 * local_ad8 * dVar91 * dVar299) -
                               dVar91 * dVar313 * dVar72 * dVar308)) -
                              dVar307 * dVar72 * dVar91 * dVar275)) - dVar58 * dVar47) -
                            dVar72 * dVar248 * dVar91 * dStack_19e0)) -
                           dVar297 * dStack_1860 * dVar73 * dVar299)) -
                          dVar91 * dStack_1860 * dVar81 * dVar308)) -
                         dVar81 * dVar248 * dVar91 * dVar275) -
                        dStack_1860 * dVar286 * dVar62 * dVar79 * dVar299)) -
                       dVar126 * dVar102 * dVar299)) - dVar126 * dVar64 * dVar299)) -
                     dVar46 * dVar63 * dVar299) - dVar46 * dVar66 * dVar299)) -
                   dVar297 * dVar60 * dVar299)) /
                  (((dVar300 - dVar313 * dVar335 * dVar91 * dVar299) + dVar61) - dVar41);
      local_ac8 = -(dVar280 * dVar46 * dVar299 +
                   dVar66 * dVar79 * dVar299 +
                   dVar63 * dVar79 * dVar299 +
                   dVar71 * dVar275 +
                   (((dVar91 * dVar60 * dVar308 +
                     dVar64 * dVar297 * dVar299 +
                     (((dVar102 * dVar297 * dVar299 +
                       ((dVar65 * dVar46 * dVar299 +
                        dVar70 * dVar275 +
                        dVar59 * dVar126 * dVar299 +
                        -dVar59 * dVar91 * dVar308 +
                        ((dVar286 * dVar62 * dVar313 * dVar79 * dVar299 +
                         ((dVar73 * dVar248 * dVar91 * dVar275 +
                          ((dVar350 * dVar308 +
                           dVar313 * dVar73 * dVar297 * dVar299 +
                           ((dVar325 * dVar26 * dStack_1860 * dVar79 * dVar299 +
                            ((dStack_1860 * dVar335 * dVar297 * dVar299 +
                             ((dVar286 * dVar325 * dStack_1860 * dVar46 * dVar299 +
                              ((dVar67 * dVar308 +
                               dStack_1860 * dVar72 * dVar126 * dVar299 +
                               dStack_1690 * local_ad8 * dVar313 * dVar91 * dVar299 +
                               dVar316 * dVar306 * dVar299 +
                               (((dVar55 * dStack_19e0 +
                                 dVar52 * dStack_19e0 +
                                 dVar69 * dVar79 * dVar275 +
                                 dVar307 * dVar68 * dVar79 * dStack_19e0 +
                                 dVar45 * dVar79 * dVar308 +
                                 dVar79 * dVar316 * dVar47 +
                                 dVar50 * dStack_19e0 +
                                 dVar53 * dStack_19e0 +
                                 dStack_1690 * (double)local_ad0 * dStack_1860 * dVar91 * dVar299 +
                                 dVar48 * dVar306 * dVar299 +
                                 (((dVar42 * dStack_19e0 +
                                   dVar344 * dVar248 * dVar79 * dStack_19e0 +
                                   dVar79 * dVar48 * dVar47 +
                                   dVar57 * dStack_19e0 +
                                   dVar54 * dStack_19e0 +
                                   dVar307 * dVar344 * dVar79 * dVar275 +
                                   dVar218 * dVar79 * dVar308 +
                                   dVar51 * dStack_19e0 +
                                   -dVar49 * dVar91 * dStack_19e0 +
                                   dVar349 * dVar299 +
                                   dVar79 * dVar140 * dVar80 + -dVar140 * dVar306 * dStack_19e0) -
                                  dVar192 * dVar80) -
                                 dVar267 * (double)local_ad0 * dVar268 * dVar91 * dVar299)) -
                                dVar217 * dVar80) - dVar247 * local_ad8 * dVar268 * dVar91 * dVar299
                               )) - dVar307 * dVar335 * dVar91 * dVar275)) -
                             dVar91 * dStack_1860 * dVar335 * dVar47)) -
                            dVar335 * dVar248 * dVar91 * dStack_19e0)) -
                           dVar91 * dVar313 * dVar73 * dVar47)) -
                          dVar307 * dVar73 * dVar91 * dStack_19e0)) -
                         dVar313 * dVar81 * dVar126 * dVar299)) -
                        dVar62 * dVar26 * dVar313 * dVar46 * dVar299)) - dVar91 * dVar102 * dVar47))
                      - dVar169 * dStack_19e0) - dVar91 * dVar64 * dVar47)) -
                    dVar60 * dVar126 * dVar299) - dVar43 * dStack_19e0)) /
                  ((dVar67 * dVar299 + dVar300 + dVar61) - dVar41);
      local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      local_ab8 = (undefined1  [8])&local_548;
      dStack_ab0 = 0.0;
      local_aa8.m_other = 4.94065645841247e-324;
      pMStack_aa0 = (Matrix<double,_6,_6,_0,_6,_6> *)0x1;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_ad0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_ab8,
                           (Scalar *)local_288);
      local_e58.m_xpr = (XprTypeNested)0x0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,(Scalar *)&local_e58);
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_ac0);
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_ad8);
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,(Scalar *)&local_ad0);
      local_ae0 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_ae0);
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_ac8);
      local_ae8 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_ae8);
      local_af0 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_af0);
      local_af8 = 1.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_af8);
      local_b00 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_b00);
      local_b08 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_b08);
      local_b10 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_b10);
      local_b18 = 0.0;
      pCVar29 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                          (pCVar29,&local_b18);
      local_b20 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar29,&local_b20);
      if (((long)(pMStack_aa0->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).
                 m_storage.m_data.array + (long)dStack_ab0 != 4) ||
         (local_aa8.m_other != 1.97626258336499e-323)) {
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
                     );
      }
      local_e58.m_xpr = &local_138;
      local_e50 = &local_548;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_4,_4,_0,_4,_4> *)local_ab8,&local_e58,
            (assign_op<double,_double> *)local_288);
      lVar31 = 0;
      do {
        dVar169 = *(double *)
                   ((long)(local_e50->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                          m_storage.m_data.array + lVar31);
        dVar45 = *(double *)
                  ((long)(local_e50->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar31 + 8);
        dVar72 = *(double *)
                  ((long)(local_e50->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar31 + 0x10);
        dVar335 = *(double *)
                   ((long)(local_e50->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                          m_storage.m_data.array + lVar31 + 0x18);
        *(double *)(local_288 + lVar31) =
             local_a58 * dVar335 +
             (double)local_a78 * dVar72 + local_a98 * dVar45 + (double)local_ab8 * dVar169;
        *(double *)(local_288 + lVar31 + 8) =
             dStack_a50 * dVar335 +
             (double)vStack_a70.m_value * dVar72 +
             (double)pMStack_a90 * dVar45 + dStack_ab0 * dVar169;
        *(double *)(local_288 + lVar31 + 0x10) =
             dVar335 * local_a48 +
             dVar72 * (double)vStack_a68.m_value +
             dVar45 * (double)local_a88.m_value + dVar169 * local_aa8.m_other;
        *(double *)(local_288 + lVar31 + 0x18) =
             dVar335 * dStack_a40 +
             dVar72 * dStack_a60 +
             dVar45 * (double)vStack_a80.m_value + dVar169 * (double)pMStack_aa0;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      lVar31 = 0;
      do {
        dVar169 = *(double *)
                   ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array + lVar31 + -0x80);
        dVar45 = *(double *)
                  ((long)(&local_168)[-3].
                         super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                         m_data.array + lVar31);
        dVar72 = *(double *)
                  ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                         m_storage.m_data.array + lVar31 + -0x70);
        dVar335 = *(double *)
                   ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                          m_storage.m_data.array + lVar31 + -0x68);
        *(double *)(local_ab8 + lVar31) =
             (double)local_288._96_8_ * dVar335 +
             (double)local_288._64_8_ * dVar72 +
             (double)local_288._32_8_ * dVar45 + (double)local_288._0_8_ * dVar169;
        *(double *)((long)&dStack_ab0 + lVar31) =
             (double)local_288._104_8_ * dVar335 +
             (double)local_288._72_8_ * dVar72 +
             (double)local_288._40_8_ * dVar45 + (double)local_288._8_8_ * dVar169;
        *(double *)((long)&local_aa8.m_other + lVar31) =
             dVar335 * (double)local_288._112_8_ +
             dVar72 * (double)local_288._80_8_ +
             dVar45 * (double)local_288._48_8_ + dVar169 * (double)local_288._16_8_;
        *(double *)((long)&pMStack_aa0 + lVar31) =
             dVar335 * (double)local_288._120_8_ +
             dVar72 * (double)local_288._88_8_ +
             dVar45 * (double)local_288._56_8_ + dVar169 * (double)local_288._24_8_;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x80);
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_ab8;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = dStack_ab0;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = local_aa8.m_other;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = (double)pMStack_aa0;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = local_a98;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = (double)pMStack_a90;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = (double)local_a88.m_value;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = (double)vStack_a80.m_value;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = (double)local_a78;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = (double)vStack_a70.m_value;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = (double)vStack_a68.m_value;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = dStack_a60;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_a58;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = dStack_a50;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_a48;
      local_548.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = dStack_a40;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,__position,&local_548);
      }
      else {
        pMVar34 = &local_548;
        iVar36._M_current = __position._M_current;
        for (lVar31 = 0x10; lVar31 != 0; lVar31 = lVar31 + -1) {
          ((iVar36._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar34->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar34 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar34 + ((ulong)bVar40 * -2 + 1) * 8);
          iVar36._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar36._M_current + ((ulong)bVar40 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar37 = iVar37 + 1;
    } while (iVar37 != iVar38);
  }
  if (local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_fd0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a10.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a10.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a10.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a10.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}